

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [12];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  byte bVar56;
  byte bVar57;
  long lVar58;
  byte bVar59;
  ulong uVar60;
  ulong uVar61;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined8 in_R10;
  bool bVar62;
  undefined1 uVar63;
  undefined1 uVar64;
  uint uVar65;
  uint uVar125;
  uint uVar126;
  uint uVar128;
  uint uVar129;
  uint uVar130;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  uint uVar127;
  uint uVar131;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float pp;
  float fVar132;
  float fVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar146;
  undefined4 uVar147;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar156 [16];
  undefined1 auVar160 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar206 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined1 auVar224 [32];
  undefined4 uVar226;
  undefined4 uVar227;
  undefined1 auVar225 [64];
  undefined4 uVar228;
  undefined1 auVar229 [28];
  undefined1 auVar230 [64];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  float fVar237;
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  vfloat<8> dOdO;
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_a28;
  undefined1 local_8a0 [16];
  uint local_890;
  uint local_88c;
  float local_888;
  float local_884;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [16];
  Primitive *local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 auStack_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  RTCHitN local_460 [16];
  undefined1 auStack_450 [16];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  uint local_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  uVar61 = (ulong)(byte)prim[1];
  fVar237 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar75 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar74 = vsubps_avx(auVar68,*(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  fVar194 = fVar237 * auVar74._0_4_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar61 * 4 + 6);
  auVar82 = vpmovsxbd_avx2(auVar68);
  fVar132 = fVar237 * auVar75._0_4_;
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar61 * 5 + 6);
  auVar80 = vpmovsxbd_avx2(auVar69);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar61 * 6 + 6);
  auVar83 = vpmovsxbd_avx2(auVar70);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar61 * 0xb + 6);
  auVar84 = vpmovsxbd_avx2(auVar71);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar61 * 0xc + 6);
  auVar85 = vpmovsxbd_avx2(auVar66);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar61 * 0xd + 6);
  auVar81 = vpmovsxbd_avx2(auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar61 * 0x12 + 6);
  auVar86 = vpmovsxbd_avx2(auVar73);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar61 * 0x13 + 6);
  auVar87 = vpmovsxbd_avx2(auVar67);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar61 * 0x14 + 6);
  auVar89 = vpmovsxbd_avx2(auVar76);
  auVar88 = vcvtdq2ps_avx(auVar89);
  auVar100._8_4_ = 1;
  auVar100._0_8_ = 0x100000001;
  auVar100._12_4_ = 1;
  auVar100._16_4_ = 1;
  auVar100._20_4_ = 1;
  auVar100._24_4_ = 1;
  auVar100._28_4_ = 1;
  auVar98._4_4_ = fVar132;
  auVar98._0_4_ = fVar132;
  auVar98._8_4_ = fVar132;
  auVar98._12_4_ = fVar132;
  auVar98._16_4_ = fVar132;
  auVar98._20_4_ = fVar132;
  auVar98._24_4_ = fVar132;
  auVar98._28_4_ = fVar132;
  auVar79 = ZEXT1632(CONCAT412(fVar237 * auVar75._12_4_,
                               CONCAT48(fVar237 * auVar75._8_4_,
                                        CONCAT44(fVar237 * auVar75._4_4_,fVar132))));
  auVar90 = vpermps_avx2(auVar100,auVar79);
  auVar77 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar78 = vpermps_avx512vl(auVar77,auVar79);
  fVar132 = auVar78._0_4_;
  auVar207._0_4_ = fVar132 * auVar83._0_4_;
  fVar161 = auVar78._4_4_;
  auVar207._4_4_ = fVar161 * auVar83._4_4_;
  fVar163 = auVar78._8_4_;
  auVar207._8_4_ = fVar163 * auVar83._8_4_;
  fVar165 = auVar78._12_4_;
  auVar207._12_4_ = fVar165 * auVar83._12_4_;
  fVar133 = auVar78._16_4_;
  auVar207._16_4_ = fVar133 * auVar83._16_4_;
  fVar167 = auVar78._20_4_;
  auVar207._20_4_ = fVar167 * auVar83._20_4_;
  fVar169 = auVar78._24_4_;
  auVar207._28_36_ = in_ZMM4._28_36_;
  auVar207._24_4_ = fVar169 * auVar83._24_4_;
  auVar79._4_4_ = auVar81._4_4_ * fVar161;
  auVar79._0_4_ = auVar81._0_4_ * fVar132;
  auVar79._8_4_ = auVar81._8_4_ * fVar163;
  auVar79._12_4_ = auVar81._12_4_ * fVar165;
  auVar79._16_4_ = auVar81._16_4_ * fVar133;
  auVar79._20_4_ = auVar81._20_4_ * fVar167;
  auVar79._24_4_ = auVar81._24_4_ * fVar169;
  auVar79._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = fVar161 * auVar88._4_4_;
  auVar89._0_4_ = fVar132 * auVar88._0_4_;
  auVar89._8_4_ = fVar163 * auVar88._8_4_;
  auVar89._12_4_ = fVar165 * auVar88._12_4_;
  auVar89._16_4_ = fVar133 * auVar88._16_4_;
  auVar89._20_4_ = fVar167 * auVar88._20_4_;
  auVar89._24_4_ = fVar169 * auVar88._24_4_;
  auVar89._28_4_ = auVar78._28_4_;
  auVar68 = vfmadd231ps_fma(auVar207._0_32_,auVar90,auVar80);
  auVar69 = vfmadd231ps_fma(auVar79,auVar90,auVar85);
  auVar70 = vfmadd231ps_fma(auVar89,auVar87,auVar90);
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar98,auVar82);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar98,auVar84);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar86,auVar98);
  auVar99._4_4_ = fVar194;
  auVar99._0_4_ = fVar194;
  auVar99._8_4_ = fVar194;
  auVar99._12_4_ = fVar194;
  auVar99._16_4_ = fVar194;
  auVar99._20_4_ = fVar194;
  auVar99._24_4_ = fVar194;
  auVar99._28_4_ = fVar194;
  auVar90 = ZEXT1632(CONCAT412(fVar237 * auVar74._12_4_,
                               CONCAT48(fVar237 * auVar74._8_4_,
                                        CONCAT44(fVar237 * auVar74._4_4_,fVar194))));
  auVar89 = vpermps_avx2(auVar100,auVar90);
  auVar79 = vpermps_avx512vl(auVar77,auVar90);
  fVar237 = auVar79._0_4_;
  fVar132 = auVar79._4_4_;
  auVar90._4_4_ = fVar132 * auVar83._4_4_;
  auVar90._0_4_ = fVar237 * auVar83._0_4_;
  fVar161 = auVar79._8_4_;
  auVar90._8_4_ = fVar161 * auVar83._8_4_;
  fVar163 = auVar79._12_4_;
  auVar90._12_4_ = fVar163 * auVar83._12_4_;
  fVar165 = auVar79._16_4_;
  auVar90._16_4_ = fVar165 * auVar83._16_4_;
  fVar133 = auVar79._20_4_;
  auVar90._20_4_ = fVar133 * auVar83._20_4_;
  fVar167 = auVar79._24_4_;
  auVar90._24_4_ = fVar167 * auVar83._24_4_;
  auVar90._28_4_ = auVar83._28_4_;
  auVar93._0_4_ = fVar237 * auVar81._0_4_;
  auVar93._4_4_ = fVar132 * auVar81._4_4_;
  auVar93._8_4_ = fVar161 * auVar81._8_4_;
  auVar93._12_4_ = fVar163 * auVar81._12_4_;
  auVar93._16_4_ = fVar165 * auVar81._16_4_;
  auVar93._20_4_ = fVar133 * auVar81._20_4_;
  auVar93._24_4_ = fVar167 * auVar81._24_4_;
  auVar93._28_4_ = 0;
  auVar81._4_4_ = fVar132 * auVar88._4_4_;
  auVar81._0_4_ = fVar237 * auVar88._0_4_;
  auVar81._8_4_ = fVar161 * auVar88._8_4_;
  auVar81._12_4_ = fVar163 * auVar88._12_4_;
  auVar81._16_4_ = fVar165 * auVar88._16_4_;
  auVar81._20_4_ = fVar133 * auVar88._20_4_;
  auVar81._24_4_ = fVar167 * auVar88._24_4_;
  auVar81._28_4_ = auVar88._28_4_;
  auVar71 = vfmadd231ps_fma(auVar90,auVar89,auVar80);
  auVar66 = vfmadd231ps_fma(auVar93,auVar89,auVar85);
  auVar72 = vfmadd231ps_fma(auVar81,auVar89,auVar87);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar99,auVar82);
  auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar99,auVar84);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar99,auVar86);
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95._16_4_ = 0x7fffffff;
  auVar95._20_4_ = 0x7fffffff;
  auVar95._24_4_ = 0x7fffffff;
  auVar95._28_4_ = 0x7fffffff;
  auVar97._8_4_ = 0x219392ef;
  auVar97._0_8_ = 0x219392ef219392ef;
  auVar97._12_4_ = 0x219392ef;
  auVar97._16_4_ = 0x219392ef;
  auVar97._20_4_ = 0x219392ef;
  auVar97._24_4_ = 0x219392ef;
  auVar97._28_4_ = 0x219392ef;
  auVar82 = vandps_avx(ZEXT1632(auVar68),auVar95);
  uVar60 = vcmpps_avx512vl(auVar82,auVar97,1);
  bVar62 = (bool)((byte)uVar60 & 1);
  auVar77._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._0_4_;
  bVar62 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._4_4_;
  bVar62 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._8_4_;
  bVar62 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._12_4_;
  auVar77._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar77._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar77._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar77._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar82 = vandps_avx(ZEXT1632(auVar69),auVar95);
  uVar60 = vcmpps_avx512vl(auVar82,auVar97,1);
  bVar62 = (bool)((byte)uVar60 & 1);
  auVar78._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar69._0_4_;
  bVar62 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar69._4_4_;
  bVar62 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar69._8_4_;
  bVar62 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar69._12_4_;
  auVar78._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar78._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar78._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar78._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar82 = vandps_avx(ZEXT1632(auVar70),auVar95);
  uVar60 = vcmpps_avx512vl(auVar82,auVar97,1);
  bVar62 = (bool)((byte)uVar60 & 1);
  auVar82._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._0_4_;
  bVar62 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._4_4_;
  bVar62 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._8_4_;
  bVar62 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar80 = vrcp14ps_avx512vl(auVar77);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar96._16_4_ = 0x3f800000;
  auVar96._20_4_ = 0x3f800000;
  auVar96._24_4_ = 0x3f800000;
  auVar96._28_4_ = 0x3f800000;
  auVar68 = vfnmadd213ps_fma(auVar77,auVar80,auVar96);
  auVar68 = vfmadd132ps_fma(ZEXT1632(auVar68),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar78);
  auVar69 = vfnmadd213ps_fma(auVar78,auVar80,auVar96);
  auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar82);
  auVar70 = vfnmadd213ps_fma(auVar82,auVar80,auVar96);
  auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar80,auVar80);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 7 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar71));
  auVar86._4_4_ = auVar68._4_4_ * auVar82._4_4_;
  auVar86._0_4_ = auVar68._0_4_ * auVar82._0_4_;
  auVar86._8_4_ = auVar68._8_4_ * auVar82._8_4_;
  auVar86._12_4_ = auVar68._12_4_ * auVar82._12_4_;
  auVar86._16_4_ = auVar82._16_4_ * 0.0;
  auVar86._20_4_ = auVar82._20_4_ * 0.0;
  auVar86._24_4_ = auVar82._24_4_ * 0.0;
  auVar86._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 9 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar71));
  auVar94._0_4_ = auVar68._0_4_ * auVar82._0_4_;
  auVar94._4_4_ = auVar68._4_4_ * auVar82._4_4_;
  auVar94._8_4_ = auVar68._8_4_ * auVar82._8_4_;
  auVar94._12_4_ = auVar68._12_4_ * auVar82._12_4_;
  auVar94._16_4_ = auVar82._16_4_ * 0.0;
  auVar94._20_4_ = auVar82._20_4_ * 0.0;
  auVar94._24_4_ = auVar82._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 0xe + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar66));
  auVar87._4_4_ = auVar69._4_4_ * auVar82._4_4_;
  auVar87._0_4_ = auVar69._0_4_ * auVar82._0_4_;
  auVar87._8_4_ = auVar69._8_4_ * auVar82._8_4_;
  auVar87._12_4_ = auVar69._12_4_ * auVar82._12_4_;
  auVar87._16_4_ = auVar82._16_4_ * 0.0;
  auVar87._20_4_ = auVar82._20_4_ * 0.0;
  auVar87._24_4_ = auVar82._24_4_ * 0.0;
  auVar87._28_4_ = auVar82._28_4_;
  auVar81 = vpbroadcastd_avx512vl();
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar66));
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 0x15 + 6));
  auVar92._0_4_ = auVar69._0_4_ * auVar82._0_4_;
  auVar92._4_4_ = auVar69._4_4_ * auVar82._4_4_;
  auVar92._8_4_ = auVar69._8_4_ * auVar82._8_4_;
  auVar92._12_4_ = auVar69._12_4_ * auVar82._12_4_;
  auVar92._16_4_ = auVar82._16_4_ * 0.0;
  auVar92._20_4_ = auVar82._20_4_ * 0.0;
  auVar92._24_4_ = auVar82._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar82 = vcvtdq2ps_avx(auVar80);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar72));
  auVar88._4_4_ = auVar82._4_4_ * auVar70._4_4_;
  auVar88._0_4_ = auVar82._0_4_ * auVar70._0_4_;
  auVar88._8_4_ = auVar82._8_4_ * auVar70._8_4_;
  auVar88._12_4_ = auVar82._12_4_ * auVar70._12_4_;
  auVar88._16_4_ = auVar82._16_4_ * 0.0;
  auVar88._20_4_ = auVar82._20_4_ * 0.0;
  auVar88._24_4_ = auVar82._24_4_ * 0.0;
  auVar88._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 0x17 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar72));
  auVar91._0_4_ = auVar70._0_4_ * auVar82._0_4_;
  auVar91._4_4_ = auVar70._4_4_ * auVar82._4_4_;
  auVar91._8_4_ = auVar70._8_4_ * auVar82._8_4_;
  auVar91._12_4_ = auVar70._12_4_ * auVar82._12_4_;
  auVar91._16_4_ = auVar82._16_4_ * 0.0;
  auVar91._20_4_ = auVar82._20_4_ * 0.0;
  auVar91._24_4_ = auVar82._24_4_ * 0.0;
  auVar91._28_4_ = 0;
  auVar82 = vpminsd_avx2(auVar86,auVar94);
  auVar80 = vpminsd_avx2(auVar87,auVar92);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80 = vpminsd_avx2(auVar88,auVar91);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar83._4_4_ = uVar147;
  auVar83._0_4_ = uVar147;
  auVar83._8_4_ = uVar147;
  auVar83._12_4_ = uVar147;
  auVar83._16_4_ = uVar147;
  auVar83._20_4_ = uVar147;
  auVar83._24_4_ = uVar147;
  auVar83._28_4_ = uVar147;
  auVar80 = vmaxps_avx512vl(auVar80,auVar83);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  auVar80._16_4_ = 0x3f7ffffa;
  auVar80._20_4_ = 0x3f7ffffa;
  auVar80._24_4_ = 0x3f7ffffa;
  auVar80._28_4_ = 0x3f7ffffa;
  local_260 = vmulps_avx512vl(auVar82,auVar80);
  auVar82 = vpmaxsd_avx2(auVar86,auVar94);
  auVar80 = vpmaxsd_avx2(auVar87,auVar92);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar80 = vpmaxsd_avx2(auVar88,auVar91);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar84._4_4_ = uVar147;
  auVar84._0_4_ = uVar147;
  auVar84._8_4_ = uVar147;
  auVar84._12_4_ = uVar147;
  auVar84._16_4_ = uVar147;
  auVar84._20_4_ = uVar147;
  auVar84._24_4_ = uVar147;
  auVar84._28_4_ = uVar147;
  auVar80 = vminps_avx512vl(auVar80,auVar84);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar85._8_4_ = 0x3f800003;
  auVar85._0_8_ = 0x3f8000033f800003;
  auVar85._12_4_ = 0x3f800003;
  auVar85._16_4_ = 0x3f800003;
  auVar85._20_4_ = 0x3f800003;
  auVar85._24_4_ = 0x3f800003;
  auVar85._28_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar85);
  uVar16 = vcmpps_avx512vl(local_260,auVar82,2);
  uVar19 = vpcmpgtd_avx512vl(auVar81,_DAT_01fb4ba0);
  local_7c8 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar16 & (byte)uVar19));
  local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_7d0 = prim;
LAB_01a73074:
  if (local_7c8 == 0) {
    return;
  }
  lVar58 = 0;
  for (uVar60 = local_7c8; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  uVar5 = *(uint *)(prim + 2);
  uVar6 = *(uint *)(prim + lVar58 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar6);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar58 = *(long *)&pGVar7[1].time_range.upper;
  auVar68 = *(undefined1 (*) [16])(lVar58 + (long)p_Var8 * uVar60);
  auVar69 = *(undefined1 (*) [16])(lVar58 + (uVar60 + 1) * (long)p_Var8);
  auVar70 = *(undefined1 (*) [16])(lVar58 + (uVar60 + 2) * (long)p_Var8);
  local_7c8 = local_7c8 - 1 & local_7c8;
  auVar71 = *(undefined1 (*) [16])(lVar58 + (uVar60 + 3) * (long)p_Var8);
  if (local_7c8 != 0) {
    uVar61 = local_7c8 - 1 & local_7c8;
    for (uVar60 = local_7c8; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    }
    if (uVar61 != 0) {
      for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar72 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar66 = vunpcklps_avx512vl(local_380._0_16_,local_3a0._0_16_);
  _local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar76 = local_3c0._0_16_;
  local_690 = vinsertps_avx512f(auVar66,auVar76,0x28);
  auVar74._0_4_ = auVar68._0_4_ + auVar69._0_4_ + auVar70._0_4_ + auVar71._0_4_;
  auVar74._4_4_ = auVar68._4_4_ + auVar69._4_4_ + auVar70._4_4_ + auVar71._4_4_;
  auVar74._8_4_ = auVar68._8_4_ + auVar69._8_4_ + auVar70._8_4_ + auVar71._8_4_;
  auVar74._12_4_ = auVar68._12_4_ + auVar69._12_4_ + auVar70._12_4_ + auVar71._12_4_;
  auVar75._8_4_ = 0x3e800000;
  auVar75._0_8_ = 0x3e8000003e800000;
  auVar75._12_4_ = 0x3e800000;
  auVar66 = vmulps_avx512vl(auVar74,auVar75);
  auVar66 = vsubps_avx(auVar66,auVar72);
  auVar66 = vdpps_avx(auVar66,local_690,0x7f);
  local_6a0 = vdpps_avx(local_690,local_690,0x7f);
  fVar237 = *(float *)(ray + k * 4 + 0x30);
  auVar214._4_12_ = ZEXT812(0) << 0x20;
  auVar214._0_4_ = local_6a0._0_4_;
  auVar67 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar214);
  auVar73 = vfnmadd213ss_fma(auVar67,local_6a0,ZEXT416(0x40000000));
  local_240 = auVar66._0_4_ * auVar67._0_4_ * auVar73._0_4_;
  auVar215._4_4_ = local_240;
  auVar215._0_4_ = local_240;
  auVar215._8_4_ = local_240;
  auVar215._12_4_ = local_240;
  fStack_670 = local_240;
  _local_680 = auVar215;
  fStack_66c = local_240;
  fStack_668 = local_240;
  fStack_664 = local_240;
  auVar66 = vfmadd231ps_fma(auVar72,local_690,auVar215);
  auVar66 = vblendps_avx(auVar66,ZEXT816(0) << 0x40,8);
  auVar68 = vsubps_avx(auVar68,auVar66);
  auVar70 = vsubps_avx(auVar70,auVar66);
  auVar69 = vsubps_avx(auVar69,auVar66);
  auVar71 = vsubps_avx(auVar71,auVar66);
  local_740 = vbroadcastss_avx512vl(auVar68);
  auVar239 = ZEXT3264(local_740);
  auVar102._8_4_ = 1;
  auVar102._0_8_ = 0x100000001;
  auVar102._12_4_ = 1;
  auVar102._16_4_ = 1;
  auVar102._20_4_ = 1;
  auVar102._24_4_ = 1;
  auVar102._28_4_ = 1;
  local_560 = ZEXT1632(auVar68);
  local_760 = vpermps_avx512vl(auVar102,local_560);
  auVar240 = ZEXT3264(local_760);
  auVar103._8_4_ = 2;
  auVar103._0_8_ = 0x200000002;
  auVar103._12_4_ = 2;
  auVar103._16_4_ = 2;
  auVar103._20_4_ = 2;
  auVar103._24_4_ = 2;
  auVar103._28_4_ = 2;
  local_780 = vpermps_avx2(auVar103,local_560);
  auVar234 = ZEXT3264(local_780);
  auVar104._8_4_ = 3;
  auVar104._0_8_ = 0x300000003;
  auVar104._12_4_ = 3;
  auVar104._16_4_ = 3;
  auVar104._20_4_ = 3;
  auVar104._24_4_ = 3;
  auVar104._28_4_ = 3;
  local_700 = vpermps_avx2(auVar104,local_560);
  uVar147 = auVar69._0_4_;
  local_720._4_4_ = uVar147;
  local_720._0_4_ = uVar147;
  local_720._8_4_ = uVar147;
  local_720._12_4_ = uVar147;
  local_720._16_4_ = uVar147;
  local_720._20_4_ = uVar147;
  local_720._24_4_ = uVar147;
  local_720._28_4_ = uVar147;
  auVar220 = ZEXT3264(local_720);
  local_5a0 = ZEXT1632(auVar69);
  local_7a0 = vpermps_avx2(auVar102,local_5a0);
  local_7c0 = vpermps_avx2(auVar103,local_5a0);
  auVar238 = ZEXT3264(local_7c0);
  auVar82 = vpermps_avx512vl(auVar104,local_5a0);
  auVar225 = ZEXT3264(local_7a0);
  auVar80 = vbroadcastss_avx512vl(auVar70);
  local_580 = ZEXT1632(auVar70);
  auVar83 = vpermps_avx512vl(auVar102,local_580);
  auVar84 = vpermps_avx512vl(auVar103,local_580);
  auVar85 = vpermps_avx512vl(auVar104,local_580);
  auVar223 = ZEXT3264(local_700);
  auVar81 = vbroadcastss_avx512vl(auVar71);
  _local_5c0 = ZEXT1632(auVar71);
  auVar86 = vpermps_avx512vl(auVar102,_local_5c0);
  auVar87 = vpermps_avx512vl(auVar103,_local_5c0);
  auVar88 = vpermps_avx512vl(auVar104,_local_5c0);
  auVar68 = vmulss_avx512f(auVar76,auVar76);
  auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),local_3a0,local_3a0);
  auVar89 = vfmadd231ps_avx512vl(auVar89,local_380,local_380);
  auVar89 = vbroadcastss_avx512vl(auVar89._0_16_);
  auVar101._8_4_ = 0x7fffffff;
  auVar101._0_8_ = 0x7fffffff7fffffff;
  auVar101._12_4_ = 0x7fffffff;
  auVar101._16_4_ = 0x7fffffff;
  auVar101._20_4_ = 0x7fffffff;
  auVar101._24_4_ = 0x7fffffff;
  auVar101._28_4_ = 0x7fffffff;
  vandps_avx512vl(auVar89,auVar101);
  local_220 = auVar89;
  local_610 = ZEXT416((uint)local_240);
  local_240 = fVar237 - local_240;
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  local_470 = vpbroadcastd_avx512vl();
  uVar60 = 0;
  local_a28 = 1;
  local_480 = vpbroadcastd_avx512vl();
  auVar68 = vsqrtss_avx(local_6a0,local_6a0);
  local_884 = auVar68._0_4_;
  auVar68 = vsqrtss_avx(local_6a0,local_6a0);
  local_888 = auVar68._0_4_;
  auVar230 = ZEXT3264(local_7c0);
  local_2f0 = ZEXT816(0x3f80000000000000);
  auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar242 = ZEXT3264(auVar90);
  auVar207 = ZEXT3264(_DAT_01f7b040);
  do {
    auVar68 = vmovshdup_avx(local_2f0);
    auVar68 = vsubps_avx(auVar68,local_2f0);
    fVar167 = auVar68._0_4_;
    fVar133 = fVar167 * 0.04761905;
    local_860._0_4_ = local_2f0._0_4_;
    local_860._4_4_ = local_860._0_4_;
    fStack_858 = (float)local_860._0_4_;
    fStack_854 = (float)local_860._0_4_;
    register0x00001290 = local_860._0_4_;
    register0x00001294 = local_860._0_4_;
    register0x00001298 = local_860._0_4_;
    register0x0000129c = local_860._0_4_;
    local_6c0._4_4_ = fVar167;
    local_6c0._0_4_ = fVar167;
    fStack_6b8 = fVar167;
    fStack_6b4 = fVar167;
    register0x000012d0 = fVar167;
    register0x000012d4 = fVar167;
    register0x000012d8 = fVar167;
    register0x000012dc = fVar167;
    auVar68 = vfmadd231ps_fma(_local_860,_local_6c0,auVar207._0_32_);
    auVar241 = auVar242._0_32_;
    auVar90 = vsubps_avx512vl(auVar241,ZEXT1632(auVar68));
    fVar132 = auVar68._0_4_;
    fVar161 = auVar68._4_4_;
    auVar206._4_4_ = auVar220._4_4_ * fVar161;
    auVar206._0_4_ = auVar220._0_4_ * fVar132;
    fVar163 = auVar68._8_4_;
    auVar206._8_4_ = auVar220._8_4_ * fVar163;
    fVar165 = auVar68._12_4_;
    auVar206._12_4_ = auVar220._12_4_ * fVar165;
    auVar206._16_4_ = auVar220._16_4_ * 0.0;
    auVar206._20_4_ = auVar220._20_4_ * 0.0;
    auVar206._24_4_ = auVar220._24_4_ * 0.0;
    auVar206._28_4_ = local_860._0_4_;
    auVar110._4_4_ = auVar225._4_4_ * fVar161;
    auVar110._0_4_ = auVar225._0_4_ * fVar132;
    auVar110._8_4_ = auVar225._8_4_ * fVar163;
    auVar110._12_4_ = auVar225._12_4_ * fVar165;
    auVar110._16_4_ = auVar225._16_4_ * 0.0;
    auVar110._20_4_ = auVar225._20_4_ * 0.0;
    auVar110._24_4_ = auVar225._24_4_ * 0.0;
    auVar110._28_4_ = fVar167;
    auVar208._0_4_ = auVar230._0_4_ * fVar132;
    auVar208._4_4_ = auVar230._4_4_ * fVar161;
    auVar208._8_4_ = auVar230._8_4_ * fVar163;
    auVar208._12_4_ = auVar230._12_4_ * fVar165;
    auVar208._16_4_ = auVar230._16_4_ * 0.0;
    auVar208._20_4_ = auVar230._20_4_ * 0.0;
    auVar208._28_36_ = auVar207._28_36_;
    auVar208._24_4_ = auVar230._24_4_ * 0.0;
    auVar79 = vmulps_avx512vl(auVar82,ZEXT1632(auVar68));
    auVar77 = vfmadd231ps_avx512vl(auVar206,auVar90,auVar239._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar110,auVar90,auVar240._0_32_);
    auVar69 = vfmadd231ps_fma(auVar208._0_32_,auVar90,auVar234._0_32_);
    auVar70 = vfmadd231ps_fma(auVar79,auVar90,auVar223._0_32_);
    auVar79 = vmulps_avx512vl(auVar80,ZEXT1632(auVar68));
    auVar95 = ZEXT1632(auVar68);
    auVar91 = vmulps_avx512vl(auVar83,auVar95);
    auVar92 = vmulps_avx512vl(auVar84,auVar95);
    auVar93 = vmulps_avx512vl(auVar85,auVar95);
    auVar71 = vfmadd231ps_fma(auVar79,auVar90,auVar220._0_32_);
    auVar66 = vfmadd231ps_fma(auVar91,auVar90,auVar225._0_32_);
    auVar72 = vfmadd231ps_fma(auVar92,auVar90,auVar230._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar82);
    auVar91 = vmulps_avx512vl(auVar81,auVar95);
    auVar92 = vmulps_avx512vl(auVar86,auVar95);
    auVar93 = vmulps_avx512vl(auVar87,auVar95);
    auVar94 = vmulps_avx512vl(auVar88,auVar95);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar90,auVar80);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar90,auVar83);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar84);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar85);
    auVar220._28_36_ = auVar238._28_36_;
    auVar220._0_28_ =
         ZEXT1628(CONCAT412(fVar165 * auVar71._12_4_,
                            CONCAT48(fVar163 * auVar71._8_4_,
                                     CONCAT44(fVar161 * auVar71._4_4_,fVar132 * auVar71._0_4_))));
    auVar95 = vmulps_avx512vl(auVar95,ZEXT1632(auVar66));
    auVar96 = vmulps_avx512vl(ZEXT1632(auVar68),ZEXT1632(auVar72));
    auVar97 = vmulps_avx512vl(ZEXT1632(auVar68),auVar79);
    auVar68 = vfmadd231ps_fma(auVar220._0_32_,auVar90,auVar77);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar78);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar69));
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar90,ZEXT1632(auVar70));
    auVar219._0_4_ = auVar91._0_4_ * fVar132;
    auVar219._4_4_ = auVar91._4_4_ * fVar161;
    auVar219._8_4_ = auVar91._8_4_ * fVar163;
    auVar219._12_4_ = auVar91._12_4_ * fVar165;
    auVar219._16_4_ = auVar91._16_4_ * 0.0;
    auVar219._20_4_ = auVar91._20_4_ * 0.0;
    auVar219._24_4_ = auVar91._24_4_ * 0.0;
    auVar219._28_4_ = 0;
    auVar111._4_4_ = auVar92._4_4_ * fVar161;
    auVar111._0_4_ = auVar92._0_4_ * fVar132;
    auVar111._8_4_ = auVar92._8_4_ * fVar163;
    auVar111._12_4_ = auVar92._12_4_ * fVar165;
    auVar111._16_4_ = auVar92._16_4_ * 0.0;
    auVar111._20_4_ = auVar92._20_4_ * 0.0;
    auVar111._24_4_ = auVar92._24_4_ * 0.0;
    auVar111._28_4_ = auVar91._28_4_;
    auVar114._4_4_ = auVar93._4_4_ * fVar161;
    auVar114._0_4_ = auVar93._0_4_ * fVar132;
    auVar114._8_4_ = auVar93._8_4_ * fVar163;
    auVar114._12_4_ = auVar93._12_4_ * fVar165;
    auVar114._16_4_ = auVar93._16_4_ * 0.0;
    auVar114._20_4_ = auVar93._20_4_ * 0.0;
    auVar114._24_4_ = auVar93._24_4_ * 0.0;
    auVar114._28_4_ = auVar92._28_4_;
    auVar115._4_4_ = auVar94._4_4_ * fVar161;
    auVar115._0_4_ = auVar94._0_4_ * fVar132;
    auVar115._8_4_ = auVar94._8_4_ * fVar163;
    auVar115._12_4_ = auVar94._12_4_ * fVar165;
    auVar115._16_4_ = auVar94._16_4_ * 0.0;
    auVar115._20_4_ = auVar94._20_4_ * 0.0;
    auVar115._24_4_ = auVar94._24_4_ * 0.0;
    auVar115._28_4_ = auVar93._28_4_;
    auVar69 = vfmadd231ps_fma(auVar219,auVar90,ZEXT1632(auVar71));
    auVar70 = vfmadd231ps_fma(auVar111,auVar90,ZEXT1632(auVar66));
    auVar71 = vfmadd231ps_fma(auVar114,auVar90,ZEXT1632(auVar72));
    auVar66 = vfmadd231ps_fma(auVar115,auVar90,auVar79);
    auVar36._28_4_ = auVar78._28_4_;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(auVar70._12_4_ * fVar165,
                            CONCAT48(auVar70._8_4_ * fVar163,
                                     CONCAT44(auVar70._4_4_ * fVar161,auVar70._0_4_ * fVar132))));
    auVar37._28_4_ = auVar77._28_4_;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(auVar71._12_4_ * fVar165,
                            CONCAT48(auVar71._8_4_ * fVar163,
                                     CONCAT44(auVar71._4_4_ * fVar161,auVar71._0_4_ * fVar132))));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar165 * auVar69._12_4_,
                                                 CONCAT48(fVar163 * auVar69._8_4_,
                                                          CONCAT44(fVar161 * auVar69._4_4_,
                                                                   fVar132 * auVar69._0_4_)))),
                              auVar90,ZEXT1632(auVar68));
    auVar92 = vfmadd231ps_avx512vl(auVar36,auVar90,auVar95);
    auVar93 = vfmadd231ps_avx512vl(auVar37,auVar90,auVar96);
    auVar79 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar66._12_4_ * fVar165,
                                            CONCAT48(auVar66._8_4_ * fVar163,
                                                     CONCAT44(auVar66._4_4_ * fVar161,
                                                              auVar66._0_4_ * fVar132)))),auVar97,
                         auVar90);
    auVar90 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar68));
    auVar77 = vsubps_avx512vl(ZEXT1632(auVar70),auVar95);
    auVar78 = vsubps_avx512vl(ZEXT1632(auVar71),auVar96);
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar66),auVar97);
    auVar231._0_4_ = fVar133 * auVar90._0_4_ * 3.0;
    auVar231._4_4_ = fVar133 * auVar90._4_4_ * 3.0;
    auVar231._8_4_ = fVar133 * auVar90._8_4_ * 3.0;
    auVar231._12_4_ = fVar133 * auVar90._12_4_ * 3.0;
    auVar231._16_4_ = fVar133 * auVar90._16_4_ * 3.0;
    auVar231._20_4_ = fVar133 * auVar90._20_4_ * 3.0;
    auVar231._24_4_ = fVar133 * auVar90._24_4_ * 3.0;
    auVar231._28_4_ = 0;
    auVar233._0_4_ = fVar133 * auVar77._0_4_ * 3.0;
    auVar233._4_4_ = fVar133 * auVar77._4_4_ * 3.0;
    auVar233._8_4_ = fVar133 * auVar77._8_4_ * 3.0;
    auVar233._12_4_ = fVar133 * auVar77._12_4_ * 3.0;
    auVar233._16_4_ = fVar133 * auVar77._16_4_ * 3.0;
    auVar233._20_4_ = fVar133 * auVar77._20_4_ * 3.0;
    auVar233._24_4_ = fVar133 * auVar77._24_4_ * 3.0;
    auVar233._28_4_ = 0;
    auVar38._4_4_ = fVar133 * auVar78._4_4_ * 3.0;
    auVar38._0_4_ = fVar133 * auVar78._0_4_ * 3.0;
    auVar38._8_4_ = fVar133 * auVar78._8_4_ * 3.0;
    auVar38._12_4_ = fVar133 * auVar78._12_4_ * 3.0;
    auVar38._16_4_ = fVar133 * auVar78._16_4_ * 3.0;
    auVar38._20_4_ = fVar133 * auVar78._20_4_ * 3.0;
    auVar38._24_4_ = fVar133 * auVar78._24_4_ * 3.0;
    auVar38._28_4_ = auVar94._28_4_;
    fVar132 = auVar91._0_4_ * 3.0 * fVar133;
    fVar161 = auVar91._4_4_ * 3.0 * fVar133;
    auVar39._4_4_ = fVar161;
    auVar39._0_4_ = fVar132;
    fVar163 = auVar91._8_4_ * 3.0 * fVar133;
    auVar39._8_4_ = fVar163;
    fVar165 = auVar91._12_4_ * 3.0 * fVar133;
    auVar39._12_4_ = fVar165;
    fVar167 = auVar91._16_4_ * 3.0 * fVar133;
    auVar39._16_4_ = fVar167;
    fVar169 = auVar91._20_4_ * 3.0 * fVar133;
    auVar39._20_4_ = fVar169;
    fVar194 = auVar91._24_4_ * 3.0 * fVar133;
    auVar39._24_4_ = fVar194;
    auVar39._28_4_ = fVar133;
    auVar68 = vxorps_avx512vl(auVar81._0_16_,auVar81._0_16_);
    auVar94 = vpermt2ps_avx512vl(ZEXT1632(auVar72),_DAT_01fb9fc0,ZEXT1632(auVar68));
    auVar95 = vpermt2ps_avx512vl(auVar92,_DAT_01fb9fc0,ZEXT1632(auVar68));
    auVar77 = ZEXT1632(auVar68);
    auVar96 = vpermt2ps_avx512vl(auVar93,_DAT_01fb9fc0,auVar77);
    auVar211._0_4_ = auVar79._0_4_ + fVar132;
    auVar211._4_4_ = auVar79._4_4_ + fVar161;
    auVar211._8_4_ = auVar79._8_4_ + fVar163;
    auVar211._12_4_ = auVar79._12_4_ + fVar165;
    auVar211._16_4_ = auVar79._16_4_ + fVar167;
    auVar211._20_4_ = auVar79._20_4_ + fVar169;
    auVar211._24_4_ = auVar79._24_4_ + fVar194;
    auVar211._28_4_ = auVar79._28_4_ + fVar133;
    auVar90 = vmaxps_avx(auVar79,auVar211);
    auVar97 = vminps_avx512vl(auVar79,auVar211);
    auVar98 = vpermt2ps_avx512vl(auVar79,_DAT_01fb9fc0,auVar77);
    auVar99 = vpermt2ps_avx512vl(auVar231,_DAT_01fb9fc0,auVar77);
    auVar100 = vpermt2ps_avx512vl(auVar233,_DAT_01fb9fc0,auVar77);
    auVar110 = ZEXT1632(auVar68);
    auVar101 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9fc0,auVar110);
    auVar79 = vpermt2ps_avx512vl(auVar39,_DAT_01fb9fc0,auVar110);
    auVar79 = vsubps_avx(auVar98,auVar79);
    auVar77 = vsubps_avx(auVar94,ZEXT1632(auVar72));
    auVar78 = vsubps_avx(auVar95,auVar92);
    auVar91 = vsubps_avx(auVar96,auVar93);
    auVar102 = vmulps_avx512vl(auVar78,auVar38);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar233,auVar91);
    auVar103 = vmulps_avx512vl(auVar91,auVar231);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar38,auVar77);
    auVar104 = vmulps_avx512vl(auVar77,auVar233);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar231,auVar78);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
    auVar103 = vmulps_avx512vl(auVar91,auVar91);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar78,auVar78);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar77,auVar77);
    auVar104 = vrcp14ps_avx512vl(auVar103);
    auVar105 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar241);
    auVar104 = vfmadd132ps_avx512vl(auVar105,auVar104,auVar104);
    auVar102 = vmulps_avx512vl(auVar102,auVar104);
    auVar105 = vmulps_avx512vl(auVar78,auVar101);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar100,auVar91);
    auVar106 = vmulps_avx512vl(auVar91,auVar99);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar101,auVar77);
    auVar107 = vmulps_avx512vl(auVar77,auVar100);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar99,auVar78);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vmulps_avx512vl(auVar105,auVar104);
    auVar102 = vmaxps_avx512vl(auVar102,auVar104);
    auVar102 = vsqrtps_avx512vl(auVar102);
    auVar104 = vmaxps_avx512vl(auVar79,auVar98);
    auVar90 = vmaxps_avx512vl(auVar90,auVar104);
    auVar104 = vaddps_avx512vl(auVar102,auVar90);
    auVar90 = vminps_avx(auVar79,auVar98);
    auVar90 = vminps_avx512vl(auVar97,auVar90);
    auVar90 = vsubps_avx512vl(auVar90,auVar102);
    auVar105._8_4_ = 0x3f800002;
    auVar105._0_8_ = 0x3f8000023f800002;
    auVar105._12_4_ = 0x3f800002;
    auVar105._16_4_ = 0x3f800002;
    auVar105._20_4_ = 0x3f800002;
    auVar105._24_4_ = 0x3f800002;
    auVar105._28_4_ = 0x3f800002;
    auVar79 = vmulps_avx512vl(auVar104,auVar105);
    auVar106._8_4_ = 0x3f7ffffc;
    auVar106._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar106._12_4_ = 0x3f7ffffc;
    auVar106._16_4_ = 0x3f7ffffc;
    auVar106._20_4_ = 0x3f7ffffc;
    auVar106._24_4_ = 0x3f7ffffc;
    auVar106._28_4_ = 0x3f7ffffc;
    local_840 = vmulps_avx512vl(auVar90,auVar106);
    auVar90 = vmulps_avx512vl(auVar79,auVar79);
    auVar79 = vrsqrt14ps_avx512vl(auVar103);
    auVar107._8_4_ = 0xbf000000;
    auVar107._0_8_ = 0xbf000000bf000000;
    auVar107._12_4_ = 0xbf000000;
    auVar107._16_4_ = 0xbf000000;
    auVar107._20_4_ = 0xbf000000;
    auVar107._24_4_ = 0xbf000000;
    auVar107._28_4_ = 0xbf000000;
    auVar97 = vmulps_avx512vl(auVar103,auVar107);
    fVar132 = auVar79._0_4_;
    fVar161 = auVar79._4_4_;
    fVar163 = auVar79._8_4_;
    fVar165 = auVar79._12_4_;
    fVar133 = auVar79._16_4_;
    fVar167 = auVar79._20_4_;
    fVar169 = auVar79._24_4_;
    auVar40._4_4_ = fVar161 * fVar161 * fVar161 * auVar97._4_4_;
    auVar40._0_4_ = fVar132 * fVar132 * fVar132 * auVar97._0_4_;
    auVar40._8_4_ = fVar163 * fVar163 * fVar163 * auVar97._8_4_;
    auVar40._12_4_ = fVar165 * fVar165 * fVar165 * auVar97._12_4_;
    auVar40._16_4_ = fVar133 * fVar133 * fVar133 * auVar97._16_4_;
    auVar40._20_4_ = fVar167 * fVar167 * fVar167 * auVar97._20_4_;
    auVar40._24_4_ = fVar169 * fVar169 * fVar169 * auVar97._24_4_;
    auVar40._28_4_ = auVar104._28_4_;
    auVar108._8_4_ = 0x3fc00000;
    auVar108._0_8_ = 0x3fc000003fc00000;
    auVar108._12_4_ = 0x3fc00000;
    auVar108._16_4_ = 0x3fc00000;
    auVar108._20_4_ = 0x3fc00000;
    auVar108._24_4_ = 0x3fc00000;
    auVar108._28_4_ = 0x3fc00000;
    auVar79 = vfmadd231ps_avx512vl(auVar40,auVar79,auVar108);
    auVar238 = ZEXT3264(auVar79);
    auVar97 = vmulps_avx512vl(auVar77,auVar79);
    auVar98 = vmulps_avx512vl(auVar78,auVar79);
    auVar102 = vmulps_avx512vl(auVar91,auVar79);
    auVar206 = ZEXT1632(auVar72);
    auVar103 = vsubps_avx512vl(auVar110,auVar206);
    auVar104 = vsubps_avx512vl(auVar110,auVar92);
    auVar105 = vsubps_avx512vl(auVar110,auVar93);
    auVar106 = vmulps_avx512vl(_local_3c0,auVar105);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_3a0,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_380,auVar103);
    auVar107 = vmulps_avx512vl(auVar105,auVar105);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar104);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar103);
    auVar108 = vmulps_avx512vl(_local_3c0,auVar102);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar98,local_3a0);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,local_380);
    auVar102 = vmulps_avx512vl(auVar105,auVar102);
    auVar98 = vfmadd231ps_avx512vl(auVar102,auVar104,auVar98);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar97);
    auVar98 = vmulps_avx512vl(auVar108,auVar108);
    auVar102 = vsubps_avx512vl(auVar89,auVar98);
    auVar109 = vmulps_avx512vl(auVar108,auVar97);
    auVar106 = vsubps_avx512vl(auVar106,auVar109);
    auVar106 = vaddps_avx512vl(auVar106,auVar106);
    auVar109 = vmulps_avx512vl(auVar97,auVar97);
    local_880 = vsubps_avx512vl(auVar107,auVar109);
    auVar90 = vsubps_avx512vl(local_880,auVar90);
    local_6e0 = vmulps_avx512vl(auVar106,auVar106);
    auVar109._8_4_ = 0x40800000;
    auVar109._0_8_ = 0x4080000040800000;
    auVar109._12_4_ = 0x40800000;
    auVar109._16_4_ = 0x40800000;
    auVar109._20_4_ = 0x40800000;
    auVar109._24_4_ = 0x40800000;
    auVar109._28_4_ = 0x40800000;
    _local_4c0 = vmulps_avx512vl(auVar102,auVar109);
    auVar107 = vmulps_avx512vl(_local_4c0,auVar90);
    auVar107 = vsubps_avx512vl(local_6e0,auVar107);
    uVar61 = vcmpps_avx512vl(auVar107,auVar110,5);
    bVar55 = (byte)uVar61;
    fVar132 = (float)local_680._0_4_;
    fVar161 = (float)local_680._4_4_;
    fVar163 = fStack_678;
    fVar165 = fStack_674;
    fVar133 = fStack_670;
    fVar167 = fStack_66c;
    fVar169 = fStack_668;
    fVar194 = fStack_664;
    if (bVar55 == 0) {
LAB_01a73dc7:
      auVar207 = ZEXT3264(_DAT_01f7b040);
      auVar239 = ZEXT3264(local_740);
      auVar240 = ZEXT3264(local_760);
      auVar234 = ZEXT3264(local_780);
      auVar223 = ZEXT3264(local_700);
      auVar220 = ZEXT3264(local_720);
      auVar225 = ZEXT3264(local_7a0);
      auVar230 = ZEXT3264(local_7c0);
    }
    else {
      auVar107 = vsqrtps_avx512vl(auVar107);
      auVar109 = vaddps_avx512vl(auVar102,auVar102);
      local_540 = vrcp14ps_avx512vl(auVar109);
      auVar110 = vfnmadd213ps_avx512vl(local_540,auVar109,auVar241);
      auVar110 = vfmadd132ps_avx512vl(auVar110,local_540,local_540);
      auVar241._8_4_ = 0x80000000;
      auVar241._0_8_ = 0x8000000080000000;
      auVar241._12_4_ = 0x80000000;
      auVar241._16_4_ = 0x80000000;
      auVar241._20_4_ = 0x80000000;
      auVar241._24_4_ = 0x80000000;
      auVar241._28_4_ = 0x80000000;
      local_660 = vxorps_avx512vl(auVar106,auVar241);
      auVar111 = vsubps_avx512vl(local_660,auVar107);
      local_640 = vmulps_avx512vl(auVar111,auVar110);
      auVar107 = vsubps_avx512vl(auVar107,auVar106);
      local_4e0 = vmulps_avx512vl(auVar107,auVar110);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar110 = vblendmps_avx512vl(auVar107,local_640);
      auVar112._0_4_ =
           (uint)(bVar55 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar107._0_4_;
      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar62 * auVar110._4_4_ | (uint)!bVar62 * auVar107._4_4_;
      bVar62 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar62 * auVar110._8_4_ | (uint)!bVar62 * auVar107._8_4_;
      bVar62 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar62 * auVar110._12_4_ | (uint)!bVar62 * auVar107._12_4_;
      bVar62 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar112._16_4_ = (uint)bVar62 * auVar110._16_4_ | (uint)!bVar62 * auVar107._16_4_;
      bVar62 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar112._20_4_ = (uint)bVar62 * auVar110._20_4_ | (uint)!bVar62 * auVar107._20_4_;
      bVar62 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar112._24_4_ = (uint)bVar62 * auVar110._24_4_ | (uint)!bVar62 * auVar107._24_4_;
      bVar62 = SUB81(uVar61 >> 7,0);
      auVar112._28_4_ = (uint)bVar62 * auVar110._28_4_ | (uint)!bVar62 * auVar107._28_4_;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar110 = vblendmps_avx512vl(auVar107,local_4e0);
      auVar113._0_4_ =
           (uint)(bVar55 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar107._0_4_;
      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar62 * auVar110._4_4_ | (uint)!bVar62 * auVar107._4_4_;
      bVar62 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar62 * auVar110._8_4_ | (uint)!bVar62 * auVar107._8_4_;
      bVar62 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar62 * auVar110._12_4_ | (uint)!bVar62 * auVar107._12_4_;
      bVar62 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar113._16_4_ = (uint)bVar62 * auVar110._16_4_ | (uint)!bVar62 * auVar107._16_4_;
      bVar62 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar113._20_4_ = (uint)bVar62 * auVar110._20_4_ | (uint)!bVar62 * auVar107._20_4_;
      bVar62 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar113._24_4_ = (uint)bVar62 * auVar110._24_4_ | (uint)!bVar62 * auVar107._24_4_;
      bVar62 = SUB81(uVar61 >> 7,0);
      auVar113._28_4_ = (uint)bVar62 * auVar110._28_4_ | (uint)!bVar62 * auVar107._28_4_;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar98,auVar107);
      local_500 = vmaxps_avx512vl(local_220,auVar107);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      local_520 = vmulps_avx512vl(local_500,auVar30);
      vandps_avx512vl(auVar102,auVar107);
      uVar17 = vcmpps_avx512vl(local_520,local_520,1);
      uVar61 = uVar61 & uVar17;
      bVar59 = (byte)uVar61;
      if (bVar59 != 0) {
        uVar17 = vcmpps_avx512vl(auVar90,_DAT_01f7b000,2);
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar102 = vblendmps_avx512vl(auVar90,auVar98);
        bVar57 = (byte)uVar17;
        uVar65 = (uint)(bVar57 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar57 & 1) * local_520._0_4_;
        bVar62 = (bool)((byte)(uVar17 >> 1) & 1);
        uVar125 = (uint)bVar62 * auVar102._4_4_ | (uint)!bVar62 * local_520._4_4_;
        bVar62 = (bool)((byte)(uVar17 >> 2) & 1);
        uVar126 = (uint)bVar62 * auVar102._8_4_ | (uint)!bVar62 * local_520._8_4_;
        bVar62 = (bool)((byte)(uVar17 >> 3) & 1);
        uVar127 = (uint)bVar62 * auVar102._12_4_ | (uint)!bVar62 * local_520._12_4_;
        bVar62 = (bool)((byte)(uVar17 >> 4) & 1);
        uVar128 = (uint)bVar62 * auVar102._16_4_ | (uint)!bVar62 * local_520._16_4_;
        bVar62 = (bool)((byte)(uVar17 >> 5) & 1);
        uVar129 = (uint)bVar62 * auVar102._20_4_ | (uint)!bVar62 * local_520._20_4_;
        bVar62 = (bool)((byte)(uVar17 >> 6) & 1);
        uVar130 = (uint)bVar62 * auVar102._24_4_ | (uint)!bVar62 * local_520._24_4_;
        bVar62 = SUB81(uVar17 >> 7,0);
        uVar131 = (uint)bVar62 * auVar102._28_4_ | (uint)!bVar62 * local_520._28_4_;
        auVar112._0_4_ = (bVar59 & 1) * uVar65 | !(bool)(bVar59 & 1) * auVar112._0_4_;
        bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar112._4_4_ = bVar62 * uVar125 | !bVar62 * auVar112._4_4_;
        bVar62 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar112._8_4_ = bVar62 * uVar126 | !bVar62 * auVar112._8_4_;
        bVar62 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar112._12_4_ = bVar62 * uVar127 | !bVar62 * auVar112._12_4_;
        bVar62 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar112._16_4_ = bVar62 * uVar128 | !bVar62 * auVar112._16_4_;
        bVar62 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar112._20_4_ = bVar62 * uVar129 | !bVar62 * auVar112._20_4_;
        bVar62 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar112._24_4_ = bVar62 * uVar130 | !bVar62 * auVar112._24_4_;
        bVar62 = SUB81(uVar61 >> 7,0);
        auVar112._28_4_ = bVar62 * uVar131 | !bVar62 * auVar112._28_4_;
        auVar90 = vblendmps_avx512vl(auVar98,auVar90);
        bVar62 = (bool)((byte)(uVar17 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar17 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar17 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar17 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
        bVar15 = SUB81(uVar17 >> 7,0);
        auVar113._0_4_ =
             (uint)(bVar59 & 1) *
             ((uint)(bVar57 & 1) * auVar90._0_4_ | !(bool)(bVar57 & 1) * uVar65) |
             !(bool)(bVar59 & 1) * auVar113._0_4_;
        bVar9 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar113._4_4_ =
             (uint)bVar9 * ((uint)bVar62 * auVar90._4_4_ | !bVar62 * uVar125) |
             !bVar9 * auVar113._4_4_;
        bVar62 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar113._8_4_ =
             (uint)bVar62 * ((uint)bVar10 * auVar90._8_4_ | !bVar10 * uVar126) |
             !bVar62 * auVar113._8_4_;
        bVar62 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar113._12_4_ =
             (uint)bVar62 * ((uint)bVar11 * auVar90._12_4_ | !bVar11 * uVar127) |
             !bVar62 * auVar113._12_4_;
        bVar62 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar113._16_4_ =
             (uint)bVar62 * ((uint)bVar12 * auVar90._16_4_ | !bVar12 * uVar128) |
             !bVar62 * auVar113._16_4_;
        bVar62 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar113._20_4_ =
             (uint)bVar62 * ((uint)bVar13 * auVar90._20_4_ | !bVar13 * uVar129) |
             !bVar62 * auVar113._20_4_;
        bVar62 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar113._24_4_ =
             (uint)bVar62 * ((uint)bVar14 * auVar90._24_4_ | !bVar14 * uVar130) |
             !bVar62 * auVar113._24_4_;
        bVar62 = SUB81(uVar61 >> 7,0);
        auVar113._28_4_ =
             (uint)bVar62 * ((uint)bVar15 * auVar90._28_4_ | !bVar15 * uVar131) |
             !bVar62 * auVar113._28_4_;
        bVar55 = (~bVar59 | bVar57) & bVar55;
      }
      if ((bVar55 & 0x7f) == 0) {
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar242 = ZEXT3264(auVar90);
        auVar207 = ZEXT3264(_DAT_01f7b040);
        auVar239 = ZEXT3264(local_740);
        auVar240 = ZEXT3264(local_760);
        auVar234 = ZEXT3264(local_780);
        auVar223 = ZEXT3264(local_700);
        auVar220 = ZEXT3264(local_720);
        auVar225 = ZEXT3264(local_7a0);
        auVar230 = ZEXT3264(local_7c0);
      }
      else {
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar98 = vxorps_avx512vl(auVar101,auVar90);
        auVar99 = vxorps_avx512vl(auVar99,auVar90);
        auVar207 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
        auVar100 = vxorps_avx512vl(auVar100,auVar90);
        auVar68 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                                 ZEXT416((uint)local_610._0_4_));
        auVar101 = vbroadcastss_avx512vl(auVar68);
        auVar101 = vminps_avx512vl(auVar101,auVar113);
        auVar54._4_4_ = fStack_23c;
        auVar54._0_4_ = local_240;
        auVar54._8_4_ = fStack_238;
        auVar54._12_4_ = fStack_234;
        auVar54._16_4_ = fStack_230;
        auVar54._20_4_ = fStack_22c;
        auVar54._24_4_ = fStack_228;
        auVar54._28_4_ = fStack_224;
        auVar102 = vmaxps_avx512vl(auVar54,auVar112);
        auVar105 = vmulps_avx512vl(auVar105,auVar38);
        auVar104 = vfmadd213ps_avx512vl(auVar104,auVar233,auVar105);
        auVar68 = vfmadd213ps_fma(auVar103,auVar231,auVar104);
        auVar103 = vmulps_avx512vl(_local_3c0,auVar38);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_3a0,auVar233);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_380,auVar231);
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar103,auVar104);
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar16 = vcmpps_avx512vl(auVar104,auVar105,1);
        auVar107 = vxorps_avx512vl(ZEXT1632(auVar68),auVar90);
        auVar110 = vrcp14ps_avx512vl(auVar103);
        auVar111 = vxorps_avx512vl(auVar103,auVar90);
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar115 = vfnmadd213ps_avx512vl(auVar110,auVar103,auVar114);
        auVar68 = vfmadd132ps_fma(auVar115,auVar110,auVar110);
        fVar146 = auVar68._0_4_ * auVar107._0_4_;
        fVar162 = auVar68._4_4_ * auVar107._4_4_;
        auVar41._4_4_ = fVar162;
        auVar41._0_4_ = fVar146;
        fVar164 = auVar68._8_4_ * auVar107._8_4_;
        auVar41._8_4_ = fVar164;
        fVar166 = auVar68._12_4_ * auVar107._12_4_;
        auVar41._12_4_ = fVar166;
        fVar168 = auVar107._16_4_ * 0.0;
        auVar41._16_4_ = fVar168;
        fVar170 = auVar107._20_4_ * 0.0;
        auVar41._20_4_ = fVar170;
        fVar171 = auVar107._24_4_ * 0.0;
        auVar41._24_4_ = fVar171;
        auVar41._28_4_ = auVar107._28_4_;
        uVar19 = vcmpps_avx512vl(auVar103,auVar111,1);
        bVar59 = (byte)uVar16 | (byte)uVar19;
        auVar236._8_4_ = 0xff800000;
        auVar236._0_8_ = 0xff800000ff800000;
        auVar236._12_4_ = 0xff800000;
        auVar236._16_4_ = 0xff800000;
        auVar236._20_4_ = 0xff800000;
        auVar236._24_4_ = 0xff800000;
        auVar236._28_4_ = 0xff800000;
        auVar115 = vblendmps_avx512vl(auVar41,auVar236);
        auVar116._0_4_ =
             (uint)(bVar59 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar110._0_4_;
        bVar62 = (bool)(bVar59 >> 1 & 1);
        auVar116._4_4_ = (uint)bVar62 * auVar115._4_4_ | (uint)!bVar62 * auVar110._4_4_;
        bVar62 = (bool)(bVar59 >> 2 & 1);
        auVar116._8_4_ = (uint)bVar62 * auVar115._8_4_ | (uint)!bVar62 * auVar110._8_4_;
        bVar62 = (bool)(bVar59 >> 3 & 1);
        auVar116._12_4_ = (uint)bVar62 * auVar115._12_4_ | (uint)!bVar62 * auVar110._12_4_;
        bVar62 = (bool)(bVar59 >> 4 & 1);
        auVar116._16_4_ = (uint)bVar62 * auVar115._16_4_ | (uint)!bVar62 * auVar110._16_4_;
        bVar62 = (bool)(bVar59 >> 5 & 1);
        auVar116._20_4_ = (uint)bVar62 * auVar115._20_4_ | (uint)!bVar62 * auVar110._20_4_;
        bVar62 = (bool)(bVar59 >> 6 & 1);
        auVar116._24_4_ = (uint)bVar62 * auVar115._24_4_ | (uint)!bVar62 * auVar110._24_4_;
        auVar116._28_4_ =
             (uint)(bVar59 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar110._28_4_;
        auVar102 = vmaxps_avx512vl(auVar102,auVar116);
        uVar19 = vcmpps_avx512vl(auVar103,auVar111,6);
        bVar59 = (byte)uVar16 | (byte)uVar19;
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar117._0_4_ =
             (uint)(bVar59 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)fVar146;
        bVar62 = (bool)(bVar59 >> 1 & 1);
        auVar117._4_4_ = (uint)bVar62 * auVar103._4_4_ | (uint)!bVar62 * (int)fVar162;
        bVar62 = (bool)(bVar59 >> 2 & 1);
        auVar117._8_4_ = (uint)bVar62 * auVar103._8_4_ | (uint)!bVar62 * (int)fVar164;
        bVar62 = (bool)(bVar59 >> 3 & 1);
        auVar117._12_4_ = (uint)bVar62 * auVar103._12_4_ | (uint)!bVar62 * (int)fVar166;
        bVar62 = (bool)(bVar59 >> 4 & 1);
        auVar117._16_4_ = (uint)bVar62 * auVar103._16_4_ | (uint)!bVar62 * (int)fVar168;
        bVar62 = (bool)(bVar59 >> 5 & 1);
        auVar117._20_4_ = (uint)bVar62 * auVar103._20_4_ | (uint)!bVar62 * (int)fVar170;
        bVar62 = (bool)(bVar59 >> 6 & 1);
        auVar117._24_4_ = (uint)bVar62 * auVar103._24_4_ | (uint)!bVar62 * (int)fVar171;
        auVar117._28_4_ =
             (uint)(bVar59 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar107._28_4_;
        auVar107 = vminps_avx512vl(auVar101,auVar117);
        auVar68 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
        auVar94 = vsubps_avx512vl(ZEXT1632(auVar68),auVar94);
        auVar95 = vsubps_avx512vl(ZEXT1632(auVar68),auVar95);
        auVar101 = ZEXT1632(auVar68);
        auVar96 = vsubps_avx512vl(auVar101,auVar96);
        auVar96 = vmulps_avx512vl(auVar96,auVar98);
        auVar95 = vfmadd231ps_avx512vl(auVar96,auVar100,auVar95);
        auVar94 = vfmadd231ps_avx512vl(auVar95,auVar99,auVar94);
        auVar95 = vmulps_avx512vl(_local_3c0,auVar98);
        auVar95 = vfmadd231ps_avx512vl(auVar95,local_3a0,auVar100);
        auVar95 = vfmadd231ps_avx512vl(auVar95,local_380,auVar99);
        vandps_avx512vl(auVar95,auVar104);
        uVar16 = vcmpps_avx512vl(auVar95,auVar105,1);
        auVar94 = vxorps_avx512vl(auVar94,auVar90);
        auVar96 = vrcp14ps_avx512vl(auVar95);
        auVar90 = vxorps_avx512vl(auVar95,auVar90);
        auVar98 = vfnmadd213ps_avx512vl(auVar96,auVar95,auVar114);
        auVar68 = vfmadd132ps_fma(auVar98,auVar96,auVar96);
        fVar146 = auVar68._0_4_ * auVar94._0_4_;
        fVar162 = auVar68._4_4_ * auVar94._4_4_;
        auVar42._4_4_ = fVar162;
        auVar42._0_4_ = fVar146;
        fVar164 = auVar68._8_4_ * auVar94._8_4_;
        auVar42._8_4_ = fVar164;
        fVar166 = auVar68._12_4_ * auVar94._12_4_;
        auVar42._12_4_ = fVar166;
        fVar168 = auVar94._16_4_ * 0.0;
        auVar42._16_4_ = fVar168;
        fVar170 = auVar94._20_4_ * 0.0;
        auVar42._20_4_ = fVar170;
        fVar171 = auVar94._24_4_ * 0.0;
        auVar42._24_4_ = fVar171;
        auVar42._28_4_ = auVar94._28_4_;
        uVar19 = vcmpps_avx512vl(auVar95,auVar90,1);
        bVar59 = (byte)uVar16 | (byte)uVar19;
        auVar98 = vblendmps_avx512vl(auVar42,auVar236);
        auVar118._0_4_ =
             (uint)(bVar59 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar96._0_4_;
        bVar62 = (bool)(bVar59 >> 1 & 1);
        auVar118._4_4_ = (uint)bVar62 * auVar98._4_4_ | (uint)!bVar62 * auVar96._4_4_;
        bVar62 = (bool)(bVar59 >> 2 & 1);
        auVar118._8_4_ = (uint)bVar62 * auVar98._8_4_ | (uint)!bVar62 * auVar96._8_4_;
        bVar62 = (bool)(bVar59 >> 3 & 1);
        auVar118._12_4_ = (uint)bVar62 * auVar98._12_4_ | (uint)!bVar62 * auVar96._12_4_;
        bVar62 = (bool)(bVar59 >> 4 & 1);
        auVar118._16_4_ = (uint)bVar62 * auVar98._16_4_ | (uint)!bVar62 * auVar96._16_4_;
        bVar62 = (bool)(bVar59 >> 5 & 1);
        auVar118._20_4_ = (uint)bVar62 * auVar98._20_4_ | (uint)!bVar62 * auVar96._20_4_;
        bVar62 = (bool)(bVar59 >> 6 & 1);
        auVar118._24_4_ = (uint)bVar62 * auVar98._24_4_ | (uint)!bVar62 * auVar96._24_4_;
        auVar118._28_4_ =
             (uint)(bVar59 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar96._28_4_;
        local_360 = vmaxps_avx(auVar102,auVar118);
        uVar19 = vcmpps_avx512vl(auVar95,auVar90,6);
        bVar59 = (byte)uVar16 | (byte)uVar19;
        auVar119._0_4_ =
             (uint)(bVar59 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)fVar146;
        bVar62 = (bool)(bVar59 >> 1 & 1);
        auVar119._4_4_ = (uint)bVar62 * auVar103._4_4_ | (uint)!bVar62 * (int)fVar162;
        bVar62 = (bool)(bVar59 >> 2 & 1);
        auVar119._8_4_ = (uint)bVar62 * auVar103._8_4_ | (uint)!bVar62 * (int)fVar164;
        bVar62 = (bool)(bVar59 >> 3 & 1);
        auVar119._12_4_ = (uint)bVar62 * auVar103._12_4_ | (uint)!bVar62 * (int)fVar166;
        bVar62 = (bool)(bVar59 >> 4 & 1);
        auVar119._16_4_ = (uint)bVar62 * auVar103._16_4_ | (uint)!bVar62 * (int)fVar168;
        bVar62 = (bool)(bVar59 >> 5 & 1);
        auVar119._20_4_ = (uint)bVar62 * auVar103._20_4_ | (uint)!bVar62 * (int)fVar170;
        bVar62 = (bool)(bVar59 >> 6 & 1);
        auVar119._24_4_ = (uint)bVar62 * auVar103._24_4_ | (uint)!bVar62 * (int)fVar171;
        auVar119._28_4_ =
             (uint)(bVar59 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar94._28_4_;
        local_2a0 = vminps_avx(auVar107,auVar119);
        uVar16 = vcmpps_avx512vl(local_360,local_2a0,2);
        bVar55 = bVar55 & 0x7f & (byte)uVar16;
        if (bVar55 == 0) {
          auVar242 = ZEXT3264(auVar114);
          goto LAB_01a73dc7;
        }
        auVar94 = vmaxps_avx512vl(auVar101,local_840);
        auVar90 = vfmadd213ps_avx512vl(local_640,auVar108,auVar97);
        fVar146 = auVar79._0_4_;
        fVar162 = auVar79._4_4_;
        auVar43._4_4_ = fVar162 * auVar90._4_4_;
        auVar43._0_4_ = fVar146 * auVar90._0_4_;
        fVar164 = auVar79._8_4_;
        auVar43._8_4_ = fVar164 * auVar90._8_4_;
        fVar166 = auVar79._12_4_;
        auVar43._12_4_ = fVar166 * auVar90._12_4_;
        fVar168 = auVar79._16_4_;
        auVar43._16_4_ = fVar168 * auVar90._16_4_;
        fVar170 = auVar79._20_4_;
        auVar43._20_4_ = fVar170 * auVar90._20_4_;
        fVar171 = auVar79._24_4_;
        auVar43._24_4_ = fVar171 * auVar90._24_4_;
        auVar43._28_4_ = auVar90._28_4_;
        auVar90 = vfmadd213ps_avx512vl(local_4e0,auVar108,auVar97);
        auVar44._4_4_ = fVar162 * auVar90._4_4_;
        auVar44._0_4_ = fVar146 * auVar90._0_4_;
        auVar44._8_4_ = fVar164 * auVar90._8_4_;
        auVar44._12_4_ = fVar166 * auVar90._12_4_;
        auVar44._16_4_ = fVar168 * auVar90._16_4_;
        auVar44._20_4_ = fVar170 * auVar90._20_4_;
        auVar44._24_4_ = fVar171 * auVar90._24_4_;
        auVar44._28_4_ = auVar90._28_4_;
        auVar90 = vminps_avx512vl(auVar43,auVar114);
        auVar51 = ZEXT812(0);
        auVar95 = ZEXT1232(auVar51) << 0x20;
        auVar90 = vmaxps_avx(auVar90,ZEXT1232(auVar51) << 0x20);
        auVar96 = vminps_avx512vl(auVar44,auVar114);
        auVar45._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar90._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar45,_local_6c0,_local_860);
        auVar90 = vmaxps_avx(auVar96,ZEXT1232(auVar51) << 0x20);
        auVar46._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
        auVar46._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
        auVar46._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
        auVar46._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
        auVar46._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
        auVar46._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
        auVar46._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
        auVar46._28_4_ = auVar90._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar46,_local_6c0,_local_860);
        auVar47._4_4_ = auVar94._4_4_ * auVar94._4_4_;
        auVar47._0_4_ = auVar94._0_4_ * auVar94._0_4_;
        auVar47._8_4_ = auVar94._8_4_ * auVar94._8_4_;
        auVar47._12_4_ = auVar94._12_4_ * auVar94._12_4_;
        auVar47._16_4_ = auVar94._16_4_ * auVar94._16_4_;
        auVar47._20_4_ = auVar94._20_4_ * auVar94._20_4_;
        auVar47._24_4_ = auVar94._24_4_ * auVar94._24_4_;
        auVar47._28_4_ = auVar94._28_4_;
        auVar90 = vsubps_avx(local_880,auVar47);
        auVar48._4_4_ = auVar90._4_4_ * (float)local_4c0._4_4_;
        auVar48._0_4_ = auVar90._0_4_ * (float)local_4c0._0_4_;
        auVar48._8_4_ = auVar90._8_4_ * fStack_4b8;
        auVar48._12_4_ = auVar90._12_4_ * fStack_4b4;
        auVar48._16_4_ = auVar90._16_4_ * fStack_4b0;
        auVar48._20_4_ = auVar90._20_4_ * fStack_4ac;
        auVar48._24_4_ = auVar90._24_4_ * fStack_4a8;
        auVar48._28_4_ = auVar94._28_4_;
        auVar94 = vsubps_avx(local_6e0,auVar48);
        uVar16 = vcmpps_avx512vl(auVar94,ZEXT1232(auVar51) << 0x20,5);
        bVar59 = (byte)uVar16;
        if (bVar59 == 0) {
          bVar59 = 0;
          auVar79 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar220 = ZEXT864(0) << 0x20;
          auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar96 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar229 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar120._8_4_ = 0x7f800000;
          auVar120._0_8_ = 0x7f8000007f800000;
          auVar120._12_4_ = 0x7f800000;
          auVar120._16_4_ = 0x7f800000;
          auVar120._20_4_ = 0x7f800000;
          auVar120._24_4_ = 0x7f800000;
          auVar120._28_4_ = 0x7f800000;
          auVar121._8_4_ = 0xff800000;
          auVar121._0_8_ = 0xff800000ff800000;
          auVar121._12_4_ = 0xff800000;
          auVar121._16_4_ = 0xff800000;
          auVar121._20_4_ = 0xff800000;
          auVar121._24_4_ = 0xff800000;
          auVar121._28_4_ = 0xff800000;
        }
        else {
          auVar69 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
          uVar61 = vcmpps_avx512vl(auVar94,auVar101,5);
          auVar94 = vsqrtps_avx(auVar94);
          auVar95 = vfnmadd213ps_avx512vl(auVar109,local_540,auVar114);
          auVar98 = vfmadd132ps_avx512vl(auVar95,local_540,local_540);
          auVar95 = vsubps_avx(local_660,auVar94);
          auVar99 = vmulps_avx512vl(auVar95,auVar98);
          auVar94 = vsubps_avx512vl(auVar94,auVar106);
          auVar98 = vmulps_avx512vl(auVar94,auVar98);
          auVar94 = vfmadd213ps_avx512vl(auVar108,auVar99,auVar97);
          auVar49._4_4_ = fVar162 * auVar94._4_4_;
          auVar49._0_4_ = fVar146 * auVar94._0_4_;
          auVar49._8_4_ = fVar164 * auVar94._8_4_;
          auVar49._12_4_ = fVar166 * auVar94._12_4_;
          auVar49._16_4_ = fVar168 * auVar94._16_4_;
          auVar49._20_4_ = fVar170 * auVar94._20_4_;
          auVar49._24_4_ = fVar171 * auVar94._24_4_;
          auVar49._28_4_ = auVar96._28_4_;
          auVar94 = vmulps_avx512vl(local_380,auVar99);
          auVar95 = vmulps_avx512vl(local_3a0,auVar99);
          auVar100 = vmulps_avx512vl(_local_3c0,auVar99);
          auVar96 = vfmadd213ps_avx512vl(auVar77,auVar49,auVar206);
          auVar94 = vsubps_avx512vl(auVar94,auVar96);
          auVar96 = vfmadd213ps_avx512vl(auVar78,auVar49,auVar92);
          auVar96 = vsubps_avx512vl(auVar95,auVar96);
          auVar68 = vfmadd213ps_fma(auVar49,auVar91,auVar93);
          auVar95 = vsubps_avx(auVar100,ZEXT1632(auVar68));
          auVar229 = auVar95._0_28_;
          auVar95 = vfmadd213ps_avx512vl(auVar108,auVar98,auVar97);
          auVar97 = vmulps_avx512vl(auVar79,auVar95);
          auVar238 = ZEXT3264(auVar97);
          auVar79 = vmulps_avx512vl(local_380,auVar98);
          auVar100 = vmulps_avx512vl(local_3a0,auVar98);
          auVar101 = vmulps_avx512vl(_local_3c0,auVar98);
          auVar68 = vfmadd213ps_fma(auVar77,auVar97,auVar206);
          auVar95 = vsubps_avx(auVar79,ZEXT1632(auVar68));
          auVar68 = vfmadd213ps_fma(auVar78,auVar97,auVar92);
          auVar79 = vsubps_avx512vl(auVar100,ZEXT1632(auVar68));
          auVar68 = vfmadd213ps_fma(auVar91,auVar97,auVar93);
          auVar77 = vsubps_avx512vl(auVar101,ZEXT1632(auVar68));
          auVar220 = ZEXT3264(auVar77);
          auVar190._8_4_ = 0x7f800000;
          auVar190._0_8_ = 0x7f8000007f800000;
          auVar190._12_4_ = 0x7f800000;
          auVar190._16_4_ = 0x7f800000;
          auVar190._20_4_ = 0x7f800000;
          auVar190._24_4_ = 0x7f800000;
          auVar190._28_4_ = 0x7f800000;
          auVar77 = vblendmps_avx512vl(auVar190,auVar99);
          bVar62 = (bool)((byte)uVar61 & 1);
          auVar120._0_4_ = (uint)bVar62 * auVar77._0_4_ | (uint)!bVar62 * auVar72._0_4_;
          bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar62 * auVar77._4_4_ | (uint)!bVar62 * auVar72._4_4_;
          bVar62 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar62 * auVar77._8_4_ | (uint)!bVar62 * auVar72._8_4_;
          bVar62 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar62 * auVar77._12_4_ | (uint)!bVar62 * auVar72._12_4_;
          iVar1 = (uint)((byte)(uVar61 >> 4) & 1) * auVar77._16_4_;
          auVar120._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar61 >> 5) & 1) * auVar77._20_4_;
          auVar120._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar61 >> 6) & 1) * auVar77._24_4_;
          auVar120._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar61 >> 7) * auVar77._28_4_;
          auVar120._28_4_ = iVar4;
          auVar191._8_4_ = 0xff800000;
          auVar191._0_8_ = 0xff800000ff800000;
          auVar191._12_4_ = 0xff800000;
          auVar191._16_4_ = 0xff800000;
          auVar191._20_4_ = 0xff800000;
          auVar191._24_4_ = 0xff800000;
          auVar191._28_4_ = 0xff800000;
          auVar77 = vblendmps_avx512vl(auVar191,auVar98);
          bVar62 = (bool)((byte)uVar61 & 1);
          auVar121._0_4_ = (uint)bVar62 * auVar77._0_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar62 * auVar77._4_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar62 * auVar77._8_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar62 * auVar77._12_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar121._16_4_ = (uint)bVar62 * auVar77._16_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar121._20_4_ = (uint)bVar62 * auVar77._20_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar121._24_4_ = (uint)bVar62 * auVar77._24_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = SUB81(uVar61 >> 7,0);
          auVar121._28_4_ = (uint)bVar62 * auVar77._28_4_ | (uint)!bVar62 * -0x800000;
          auVar31._8_4_ = 0x36000000;
          auVar31._0_8_ = 0x3600000036000000;
          auVar31._12_4_ = 0x36000000;
          auVar31._16_4_ = 0x36000000;
          auVar31._20_4_ = 0x36000000;
          auVar31._24_4_ = 0x36000000;
          auVar31._28_4_ = 0x36000000;
          auVar77 = vmulps_avx512vl(local_500,auVar31);
          uVar17 = vcmpps_avx512vl(auVar77,local_520,0xe);
          uVar61 = uVar61 & uVar17;
          bVar57 = (byte)uVar61;
          if (bVar57 != 0) {
            uVar17 = vcmpps_avx512vl(auVar90,ZEXT1632(auVar69),2);
            auVar224._8_4_ = 0x7f800000;
            auVar224._0_8_ = 0x7f8000007f800000;
            auVar224._12_4_ = 0x7f800000;
            auVar224._16_4_ = 0x7f800000;
            auVar224._20_4_ = 0x7f800000;
            auVar224._24_4_ = 0x7f800000;
            auVar224._28_4_ = 0x7f800000;
            auVar232._8_4_ = 0xff800000;
            auVar232._0_8_ = 0xff800000ff800000;
            auVar232._12_4_ = 0xff800000;
            auVar232._16_4_ = 0xff800000;
            auVar232._20_4_ = 0xff800000;
            auVar232._24_4_ = 0xff800000;
            auVar232._28_4_ = 0xff800000;
            auVar90 = vblendmps_avx512vl(auVar224,auVar232);
            bVar56 = (byte)uVar17;
            uVar65 = (uint)(bVar56 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar77._0_4_;
            bVar62 = (bool)((byte)(uVar17 >> 1) & 1);
            uVar125 = (uint)bVar62 * auVar90._4_4_ | (uint)!bVar62 * auVar77._4_4_;
            bVar62 = (bool)((byte)(uVar17 >> 2) & 1);
            uVar126 = (uint)bVar62 * auVar90._8_4_ | (uint)!bVar62 * auVar77._8_4_;
            bVar62 = (bool)((byte)(uVar17 >> 3) & 1);
            uVar127 = (uint)bVar62 * auVar90._12_4_ | (uint)!bVar62 * auVar77._12_4_;
            bVar62 = (bool)((byte)(uVar17 >> 4) & 1);
            uVar128 = (uint)bVar62 * auVar90._16_4_ | (uint)!bVar62 * auVar77._16_4_;
            bVar62 = (bool)((byte)(uVar17 >> 5) & 1);
            uVar129 = (uint)bVar62 * auVar90._20_4_ | (uint)!bVar62 * auVar77._20_4_;
            bVar62 = (bool)((byte)(uVar17 >> 6) & 1);
            uVar130 = (uint)bVar62 * auVar90._24_4_ | (uint)!bVar62 * auVar77._24_4_;
            bVar62 = SUB81(uVar17 >> 7,0);
            uVar131 = (uint)bVar62 * auVar90._28_4_ | (uint)!bVar62 * auVar77._28_4_;
            auVar120._0_4_ = (bVar57 & 1) * uVar65 | !(bool)(bVar57 & 1) * auVar120._0_4_;
            bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar120._4_4_ = bVar62 * uVar125 | !bVar62 * auVar120._4_4_;
            bVar62 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar120._8_4_ = bVar62 * uVar126 | !bVar62 * auVar120._8_4_;
            bVar62 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar120._12_4_ = bVar62 * uVar127 | !bVar62 * auVar120._12_4_;
            bVar62 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar120._16_4_ = bVar62 * uVar128 | (uint)!bVar62 * iVar1;
            bVar62 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar120._20_4_ = bVar62 * uVar129 | (uint)!bVar62 * iVar2;
            bVar62 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar120._24_4_ = bVar62 * uVar130 | (uint)!bVar62 * iVar3;
            bVar62 = SUB81(uVar61 >> 7,0);
            auVar120._28_4_ = bVar62 * uVar131 | (uint)!bVar62 * iVar4;
            auVar90 = vblendmps_avx512vl(auVar232,auVar224);
            bVar62 = (bool)((byte)(uVar17 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar17 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar17 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar17 >> 5) & 1);
            bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
            bVar15 = SUB81(uVar17 >> 7,0);
            auVar121._0_4_ =
                 (uint)(bVar57 & 1) *
                 ((uint)(bVar56 & 1) * auVar90._0_4_ | !(bool)(bVar56 & 1) * uVar65) |
                 !(bool)(bVar57 & 1) * auVar121._0_4_;
            bVar9 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar121._4_4_ =
                 (uint)bVar9 * ((uint)bVar62 * auVar90._4_4_ | !bVar62 * uVar125) |
                 !bVar9 * auVar121._4_4_;
            bVar62 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar121._8_4_ =
                 (uint)bVar62 * ((uint)bVar10 * auVar90._8_4_ | !bVar10 * uVar126) |
                 !bVar62 * auVar121._8_4_;
            bVar62 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar121._12_4_ =
                 (uint)bVar62 * ((uint)bVar11 * auVar90._12_4_ | !bVar11 * uVar127) |
                 !bVar62 * auVar121._12_4_;
            bVar62 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar121._16_4_ =
                 (uint)bVar62 * ((uint)bVar12 * auVar90._16_4_ | !bVar12 * uVar128) |
                 !bVar62 * auVar121._16_4_;
            bVar62 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar121._20_4_ =
                 (uint)bVar62 * ((uint)bVar13 * auVar90._20_4_ | !bVar13 * uVar129) |
                 !bVar62 * auVar121._20_4_;
            bVar62 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar121._24_4_ =
                 (uint)bVar62 * ((uint)bVar14 * auVar90._24_4_ | !bVar14 * uVar130) |
                 !bVar62 * auVar121._24_4_;
            bVar62 = SUB81(uVar61 >> 7,0);
            auVar121._28_4_ =
                 (uint)bVar62 * ((uint)bVar15 * auVar90._28_4_ | !bVar15 * uVar131) |
                 !bVar62 * auVar121._28_4_;
            bVar59 = (~bVar57 | bVar56) & bVar59;
          }
        }
        auVar223._0_4_ = (float)local_3c0._0_4_ * auVar220._0_4_;
        auVar223._4_4_ = (float)local_3c0._4_4_ * auVar220._4_4_;
        auVar223._8_4_ = fStack_3b8 * auVar220._8_4_;
        auVar223._12_4_ = fStack_3b4 * auVar220._12_4_;
        auVar223._16_4_ = fStack_3b0 * auVar220._16_4_;
        auVar223._20_4_ = fStack_3ac * auVar220._20_4_;
        auVar223._28_36_ = auVar220._28_36_;
        auVar223._24_4_ = fStack_3a8 * auVar220._24_4_;
        auVar68 = vfmadd231ps_fma(auVar223._0_32_,local_3a0,auVar79);
        auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),local_380,auVar95);
        _local_200 = local_360;
        local_1e0 = vminps_avx(local_2a0,auVar120);
        auVar221._8_4_ = 0x7fffffff;
        auVar221._0_8_ = 0x7fffffff7fffffff;
        auVar221._12_4_ = 0x7fffffff;
        auVar221._16_4_ = 0x7fffffff;
        auVar221._20_4_ = 0x7fffffff;
        auVar221._24_4_ = 0x7fffffff;
        auVar221._28_4_ = 0x7fffffff;
        auVar90 = vandps_avx(ZEXT1632(auVar68),auVar221);
        _local_2c0 = vmaxps_avx(local_360,auVar121);
        auVar222._8_4_ = 0x3e99999a;
        auVar222._0_8_ = 0x3e99999a3e99999a;
        auVar222._12_4_ = 0x3e99999a;
        auVar222._16_4_ = 0x3e99999a;
        auVar222._20_4_ = 0x3e99999a;
        auVar222._24_4_ = 0x3e99999a;
        auVar222._28_4_ = 0x3e99999a;
        uVar16 = vcmpps_avx512vl(auVar90,auVar222,1);
        uVar19 = vcmpps_avx512vl(local_360,local_1e0,2);
        bVar57 = (byte)uVar19 & bVar55;
        uVar18 = vcmpps_avx512vl(_local_2c0,local_2a0,2);
        if ((bVar55 & ((byte)uVar18 | (byte)uVar19)) == 0) {
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar242 = ZEXT3264(auVar90);
          auVar207 = ZEXT3264(_DAT_01f7b040);
          auVar239 = ZEXT3264(local_740);
          auVar240 = ZEXT3264(local_760);
          auVar234 = ZEXT3264(local_780);
          auVar223 = ZEXT3264(local_700);
          auVar220 = ZEXT3264(local_720);
          auVar225 = ZEXT3264(local_7a0);
          auVar230 = ZEXT3264(local_7c0);
        }
        else {
          _local_340 = _local_2c0;
          local_890 = (uint)(byte)((byte)uVar16 | ~bVar59);
          auVar50._4_4_ = (float)local_3c0._4_4_ * auVar229._4_4_;
          auVar50._0_4_ = (float)local_3c0._0_4_ * auVar229._0_4_;
          auVar50._8_4_ = fStack_3b8 * auVar229._8_4_;
          auVar50._12_4_ = fStack_3b4 * auVar229._12_4_;
          auVar50._16_4_ = fStack_3b0 * auVar229._16_4_;
          auVar50._20_4_ = fStack_3ac * auVar229._20_4_;
          auVar50._24_4_ = fStack_3a8 * auVar229._24_4_;
          auVar50._28_4_ = local_2c0._28_4_;
          auVar68 = vfmadd213ps_fma(auVar96,local_3a0,auVar50);
          auVar68 = vfmadd213ps_fma(auVar94,local_380,ZEXT1632(auVar68));
          auVar90 = vandps_avx(ZEXT1632(auVar68),auVar221);
          uVar16 = vcmpps_avx512vl(auVar90,auVar222,1);
          bVar59 = (byte)uVar16 | ~bVar59;
          auVar140._8_4_ = 2;
          auVar140._0_8_ = 0x200000002;
          auVar140._12_4_ = 2;
          auVar140._16_4_ = 2;
          auVar140._20_4_ = 2;
          auVar140._24_4_ = 2;
          auVar140._28_4_ = 2;
          auVar32._8_4_ = 3;
          auVar32._0_8_ = 0x300000003;
          auVar32._12_4_ = 3;
          auVar32._16_4_ = 3;
          auVar32._20_4_ = 3;
          auVar32._24_4_ = 3;
          auVar32._28_4_ = 3;
          auVar90 = vpblendmd_avx512vl(auVar140,auVar32);
          local_280._0_4_ = (uint)(bVar59 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar59 & 1) * 2;
          bVar62 = (bool)(bVar59 >> 1 & 1);
          local_280._4_4_ = (uint)bVar62 * auVar90._4_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar59 >> 2 & 1);
          local_280._8_4_ = (uint)bVar62 * auVar90._8_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar59 >> 3 & 1);
          local_280._12_4_ = (uint)bVar62 * auVar90._12_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar59 >> 4 & 1);
          local_280._16_4_ = (uint)bVar62 * auVar90._16_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar59 >> 5 & 1);
          local_280._20_4_ = (uint)bVar62 * auVar90._20_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar59 >> 6 & 1);
          local_280._24_4_ = (uint)bVar62 * auVar90._24_4_ | (uint)!bVar62 * 2;
          local_280._28_4_ = (uint)(bVar59 >> 7) * auVar90._28_4_ | (uint)!(bool)(bVar59 >> 7) * 2;
          local_2e0 = vpbroadcastd_avx512vl();
          uVar16 = vpcmpd_avx512vl(local_2e0,local_280,5);
          local_88c = (uint)bVar57;
          local_320 = local_360._0_4_ + (float)local_680._0_4_;
          fStack_31c = local_360._4_4_ + (float)local_680._4_4_;
          fStack_318 = local_360._8_4_ + fStack_678;
          fStack_314 = local_360._12_4_ + fStack_674;
          fStack_310 = local_360._16_4_ + fStack_670;
          fStack_30c = local_360._20_4_ + fStack_66c;
          fStack_308 = local_360._24_4_ + fStack_668;
          fStack_304 = local_360._28_4_ + fStack_664;
          for (bVar57 = (byte)uVar16 & bVar57; auVar90 = _local_860, bVar57 != 0;
              bVar57 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar57 & (byte)uVar16) {
            auVar141._8_4_ = 0x7f800000;
            auVar141._0_8_ = 0x7f8000007f800000;
            auVar141._12_4_ = 0x7f800000;
            auVar141._16_4_ = 0x7f800000;
            auVar141._20_4_ = 0x7f800000;
            auVar141._24_4_ = 0x7f800000;
            auVar141._28_4_ = 0x7f800000;
            auVar79 = vblendmps_avx512vl(auVar141,local_360);
            auVar122._0_4_ =
                 (uint)(bVar57 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar57 & 1) * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 1 & 1);
            auVar122._4_4_ = (uint)bVar62 * auVar79._4_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 2 & 1);
            auVar122._8_4_ = (uint)bVar62 * auVar79._8_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 3 & 1);
            auVar122._12_4_ = (uint)bVar62 * auVar79._12_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 4 & 1);
            auVar122._16_4_ = (uint)bVar62 * auVar79._16_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 5 & 1);
            auVar122._20_4_ = (uint)bVar62 * auVar79._20_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 6 & 1);
            auVar122._24_4_ = (uint)bVar62 * auVar79._24_4_ | (uint)!bVar62 * 0x7f800000;
            auVar122._28_4_ =
                 (uint)(bVar57 >> 7) * auVar79._28_4_ | (uint)!(bool)(bVar57 >> 7) * 0x7f800000;
            auVar79 = vshufps_avx(auVar122,auVar122,0xb1);
            auVar79 = vminps_avx(auVar122,auVar79);
            auVar77 = vshufpd_avx(auVar79,auVar79,5);
            auVar79 = vminps_avx(auVar79,auVar77);
            auVar77 = vpermpd_avx2(auVar79,0x4e);
            auVar79 = vminps_avx(auVar79,auVar77);
            uVar16 = vcmpps_avx512vl(auVar122,auVar79,0);
            bVar56 = (byte)uVar16 & bVar57;
            bVar59 = bVar57;
            if (bVar56 != 0) {
              bVar59 = bVar56;
            }
            iVar2 = 0;
            for (uVar65 = (uint)bVar59; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            auVar207 = ZEXT464(*(uint *)(local_200 + (uint)(iVar2 << 2)));
            fVar161 = local_888;
            fVar132 = *(float *)(local_1a0 + (uint)(iVar2 << 2));
            uVar147 = 0;
            uVar226 = 0;
            uVar227 = 0;
            if ((float)local_6a0._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416((uint)*(float *)(local_1a0 + (uint)(iVar2 << 2)));
              local_6e0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
              local_860[1] = 0;
              local_860[0] = bVar57;
              stack0xfffffffffffff7a2 = auVar90._2_30_;
              auVar238 = ZEXT1664(auVar238._0_16_);
              fVar161 = sqrtf((float)local_6a0._0_4_);
              bVar57 = local_860[0];
              auVar207 = ZEXT1664(local_6e0._0_16_);
              fVar132 = (float)local_880._0_4_;
              uVar147 = local_880._4_4_;
              uVar226 = local_880._8_4_;
              uVar227 = local_880._12_4_;
            }
            auVar69 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar68 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar70 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar71 = vminps_avx(auVar69,auVar70);
            auVar69 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar70 = vmaxps_avx(auVar68,auVar69);
            auVar195._8_4_ = 0x7fffffff;
            auVar195._0_8_ = 0x7fffffff7fffffff;
            auVar195._12_4_ = 0x7fffffff;
            auVar68 = vandps_avx(auVar71,auVar195);
            auVar69 = vandps_avx(auVar70,auVar195);
            auVar68 = vmaxps_avx(auVar68,auVar69);
            auVar69 = vmovshdup_avx(auVar68);
            auVar69 = vmaxss_avx(auVar69,auVar68);
            auVar68 = vshufpd_avx(auVar68,auVar68,1);
            auVar68 = vmaxss_avx(auVar68,auVar69);
            local_540._0_4_ = auVar68._0_4_ * 1.9073486e-06;
            local_600 = vshufps_avx(auVar70,auVar70,0xff);
            lVar58 = 5;
            do {
              do {
                auVar90 = local_880;
                bVar62 = lVar58 == 0;
                lVar58 = lVar58 + -1;
                if (bVar62) goto LAB_01a74878;
                uVar228 = auVar207._0_4_;
                auVar134._4_4_ = uVar228;
                auVar134._0_4_ = uVar228;
                auVar134._8_4_ = uVar228;
                auVar134._12_4_ = uVar228;
                auVar69 = vfmadd132ps_fma(auVar134,ZEXT816(0) << 0x40,local_690);
                fVar163 = 1.0 - fVar132;
                auVar172._0_4_ = local_5a0._0_4_ * fVar132;
                auVar172._4_4_ = local_5a0._4_4_ * fVar132;
                auVar172._8_4_ = local_5a0._8_4_ * fVar132;
                auVar172._12_4_ = local_5a0._12_4_ * fVar132;
                local_4e0._0_16_ = ZEXT416((uint)fVar163);
                auVar196._4_4_ = fVar163;
                auVar196._0_4_ = fVar163;
                auVar196._8_4_ = fVar163;
                auVar196._12_4_ = fVar163;
                auVar68 = vfmadd231ps_fma(auVar172,auVar196,local_560._0_16_);
                auVar200._0_4_ = local_580._0_4_ * fVar132;
                auVar200._4_4_ = local_580._4_4_ * fVar132;
                auVar200._8_4_ = local_580._8_4_ * fVar132;
                auVar200._12_4_ = local_580._12_4_ * fVar132;
                auVar70 = vfmadd231ps_fma(auVar200,auVar196,local_5a0._0_16_);
                auVar209._0_4_ = fVar132 * (float)local_5c0._0_4_;
                auVar209._4_4_ = fVar132 * (float)local_5c0._4_4_;
                auVar209._8_4_ = fVar132 * fStack_5b8;
                auVar209._12_4_ = fVar132 * fStack_5b4;
                auVar71 = vfmadd231ps_fma(auVar209,auVar196,local_580._0_16_);
                auVar216._0_4_ = fVar132 * auVar70._0_4_;
                auVar216._4_4_ = fVar132 * auVar70._4_4_;
                auVar216._8_4_ = fVar132 * auVar70._8_4_;
                auVar216._12_4_ = fVar132 * auVar70._12_4_;
                auVar68 = vfmadd231ps_fma(auVar216,auVar196,auVar68);
                auVar173._0_4_ = fVar132 * auVar71._0_4_;
                auVar173._4_4_ = fVar132 * auVar71._4_4_;
                auVar173._8_4_ = fVar132 * auVar71._8_4_;
                auVar173._12_4_ = fVar132 * auVar71._12_4_;
                auVar70 = vfmadd231ps_fma(auVar173,auVar196,auVar70);
                auVar201._0_4_ = fVar132 * auVar70._0_4_;
                auVar201._4_4_ = fVar132 * auVar70._4_4_;
                auVar201._8_4_ = fVar132 * auVar70._8_4_;
                auVar201._12_4_ = fVar132 * auVar70._12_4_;
                auVar71 = vfmadd231ps_fma(auVar201,auVar68,auVar196);
                auVar68 = vsubps_avx(auVar70,auVar68);
                auVar20._8_4_ = 0x40400000;
                auVar20._0_8_ = 0x4040000040400000;
                auVar20._12_4_ = 0x40400000;
                auVar70 = vmulps_avx512vl(auVar68,auVar20);
                _local_4c0 = auVar71;
                auVar69 = vsubps_avx(auVar69,auVar71);
                auVar68 = vdpps_avx(auVar69,auVar69,0x7f);
                local_880._4_4_ = uVar147;
                local_880._0_4_ = fVar132;
                local_880._8_4_ = uVar226;
                local_880._16_16_ = auVar90._16_16_;
                local_880._12_4_ = uVar227;
                local_6e0._0_16_ = auVar207._0_16_;
                _local_860 = auVar70;
                _local_6c0 = auVar69;
                local_840._0_16_ = auVar68;
                if (auVar68._0_4_ < 0.0) {
                  auVar225._0_4_ = sqrtf(auVar68._0_4_);
                  auVar225._4_60_ = extraout_var;
                  auVar68 = auVar225._0_16_;
                  auVar70 = _local_860;
                }
                else {
                  auVar68 = vsqrtss_avx(auVar68,auVar68);
                }
                local_660._0_16_ = vdpps_avx(auVar70,auVar70,0x7f);
                fVar132 = local_660._0_4_;
                auVar174._4_12_ = ZEXT812(0) << 0x20;
                auVar174._0_4_ = fVar132;
                auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
                local_500._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar66 = vxorps_avx512vl(local_660._0_16_,auVar21);
                auVar69 = vfnmadd213ss_fma(local_500._0_16_,local_660._0_16_,ZEXT416(0x40000000));
                local_520._0_4_ = auVar69._0_4_;
                local_640._0_4_ = auVar68._0_4_;
                if (fVar132 < auVar66._0_4_) {
                  local_7e0 = auVar71;
                  auVar230._0_4_ = sqrtf(fVar132);
                  auVar230._4_60_ = extraout_var_00;
                  auVar68 = ZEXT416((uint)local_640._0_4_);
                  auVar66 = auVar230._0_16_;
                  auVar69 = local_7e0;
                  auVar70 = _local_860;
                }
                else {
                  auVar66 = vsqrtss_avx512f(local_660._0_16_,local_660._0_16_);
                  auVar69 = auVar71;
                }
                fVar163 = auVar69._0_4_;
                fVar132 = auVar71._0_4_ * 1.5 + fVar132 * -0.5 * fVar163 * fVar163 * fVar163;
                auVar217._0_4_ = auVar70._0_4_ * fVar132;
                auVar217._4_4_ = auVar70._4_4_ * fVar132;
                auVar217._8_4_ = auVar70._8_4_ * fVar132;
                auVar217._12_4_ = auVar70._12_4_ * fVar132;
                auVar69 = vdpps_avx(_local_6c0,auVar217,0x7f);
                fVar163 = auVar68._0_4_ + 1.0;
                fVar165 = auVar69._0_4_;
                auVar135._0_4_ = fVar165 * fVar165;
                auVar135._4_4_ = auVar69._4_4_ * auVar69._4_4_;
                auVar135._8_4_ = auVar69._8_4_ * auVar69._8_4_;
                auVar135._12_4_ = auVar69._12_4_ * auVar69._12_4_;
                auVar71 = vsubps_avx(local_840._0_16_,auVar135);
                fVar133 = auVar71._0_4_;
                auVar148._4_12_ = ZEXT812(0) << 0x20;
                auVar148._0_4_ = fVar133;
                auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar148);
                auVar73 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
                auVar67 = vmulss_avx512f(auVar71,ZEXT416(0xbf000000));
                if (fVar133 < 0.0) {
                  local_7e0._0_4_ = fVar163;
                  local_5f0 = fVar132;
                  fStack_5ec = fVar132;
                  fStack_5e8 = fVar132;
                  fStack_5e4 = fVar132;
                  local_5e0 = auVar217;
                  local_5d0 = auVar72;
                  fVar133 = sqrtf(fVar133);
                  auVar67 = ZEXT416(auVar67._0_4_);
                  auVar73 = ZEXT416(auVar73._0_4_);
                  auVar66 = ZEXT416(auVar66._0_4_);
                  auVar68 = ZEXT416((uint)local_640._0_4_);
                  auVar217 = local_5e0;
                  fVar163 = (float)local_7e0._0_4_;
                  auVar70 = _local_860;
                  auVar72 = local_5d0;
                  fVar132 = local_5f0;
                  fVar167 = fStack_5ec;
                  fVar169 = fStack_5e8;
                  fVar194 = fStack_5e4;
                }
                else {
                  auVar71 = vsqrtss_avx(auVar71,auVar71);
                  fVar133 = auVar71._0_4_;
                  fVar167 = fVar132;
                  fVar169 = fVar132;
                  fVar194 = fVar132;
                }
                auVar238 = ZEXT1664(auVar69);
                auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,
                                          local_4e0._0_16_);
                fVar146 = auVar71._0_4_ * 6.0;
                fVar162 = local_880._0_4_ * 6.0;
                auVar175._0_4_ = fVar162 * (float)local_5c0._0_4_;
                auVar175._4_4_ = fVar162 * (float)local_5c0._4_4_;
                auVar175._8_4_ = fVar162 * fStack_5b8;
                auVar175._12_4_ = fVar162 * fStack_5b4;
                auVar149._4_4_ = fVar146;
                auVar149._0_4_ = fVar146;
                auVar149._8_4_ = fVar146;
                auVar149._12_4_ = fVar146;
                auVar71 = vfmadd132ps_fma(auVar149,auVar175,local_580._0_16_);
                auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                          local_880._0_16_);
                fVar146 = auVar76._0_4_ * 6.0;
                auVar176._4_4_ = fVar146;
                auVar176._0_4_ = fVar146;
                auVar176._8_4_ = fVar146;
                auVar176._12_4_ = fVar146;
                auVar71 = vfmadd132ps_fma(auVar176,auVar71,local_5a0._0_16_);
                fVar146 = local_4e0._0_4_ * 6.0;
                auVar150._4_4_ = fVar146;
                auVar150._0_4_ = fVar146;
                auVar150._8_4_ = fVar146;
                auVar150._12_4_ = fVar146;
                auVar71 = vfmadd132ps_fma(auVar150,auVar71,local_560._0_16_);
                auVar177._0_4_ = auVar71._0_4_ * (float)local_660._0_4_;
                auVar177._4_4_ = auVar71._4_4_ * (float)local_660._0_4_;
                auVar177._8_4_ = auVar71._8_4_ * (float)local_660._0_4_;
                auVar177._12_4_ = auVar71._12_4_ * (float)local_660._0_4_;
                auVar71 = vdpps_avx(auVar70,auVar71,0x7f);
                fVar146 = auVar71._0_4_;
                auVar151._0_4_ = auVar70._0_4_ * fVar146;
                auVar151._4_4_ = auVar70._4_4_ * fVar146;
                auVar151._8_4_ = auVar70._8_4_ * fVar146;
                auVar151._12_4_ = auVar70._12_4_ * fVar146;
                auVar71 = vsubps_avx(auVar177,auVar151);
                fVar146 = (float)local_520._0_4_ * (float)local_500._0_4_;
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar74 = vxorps_avx512vl(auVar70,auVar22);
                auVar202._0_4_ = fVar132 * auVar71._0_4_ * fVar146;
                auVar202._4_4_ = fVar167 * auVar71._4_4_ * fVar146;
                auVar202._8_4_ = fVar169 * auVar71._8_4_ * fVar146;
                auVar202._12_4_ = fVar194 * auVar71._12_4_ * fVar146;
                auVar71 = vdpps_avx(auVar74,auVar217,0x7f);
                auVar76 = vmaxss_avx(ZEXT416((uint)local_540._0_4_),
                                     ZEXT416((uint)((float)local_6e0._0_4_ * fVar161 * 1.9073486e-06
                                                   )));
                auVar75 = vdivss_avx512f(ZEXT416((uint)local_540._0_4_),auVar66);
                auVar66 = vdpps_avx(_local_6c0,auVar202,0x7f);
                auVar68 = vfmadd213ss_fma(auVar68,ZEXT416((uint)local_540._0_4_),auVar76);
                auVar75 = vfmadd213ss_fma(ZEXT416((uint)fVar163),auVar75,auVar68);
                auVar68 = vdpps_avx(local_690,auVar217,0x7f);
                fVar163 = auVar71._0_4_ + auVar66._0_4_;
                auVar71 = vdpps_avx(_local_6c0,auVar74,0x7f);
                auVar67 = vmulss_avx512f(auVar67,auVar72);
                auVar72 = vmulss_avx512f(auVar72,auVar72);
                auVar66 = vdpps_avx(_local_6c0,local_690,0x7f);
                auVar67 = vaddss_avx512f(auVar73,ZEXT416((uint)(auVar67._0_4_ * auVar72._0_4_)));
                auVar72 = vfnmadd231ss_fma(auVar71,auVar69,ZEXT416((uint)fVar163));
                auVar73 = vfnmadd231ss_fma(auVar66,auVar69,auVar68);
                auVar71 = vpermilps_avx(_local_4c0,0xff);
                fVar133 = fVar133 - auVar71._0_4_;
                auVar71 = vshufps_avx(auVar70,auVar70,0xff);
                auVar66 = vfmsub213ss_fma(auVar72,auVar67,auVar71);
                fVar132 = auVar73._0_4_ * auVar67._0_4_;
                auVar72 = vfmsub231ss_fma(ZEXT416((uint)(auVar68._0_4_ * auVar66._0_4_)),
                                          ZEXT416((uint)fVar163),ZEXT416((uint)fVar132));
                fVar167 = auVar72._0_4_;
                fVar132 = local_880._0_4_ -
                          (fVar165 * (fVar132 / fVar167) - fVar133 * (auVar68._0_4_ / fVar167));
                uVar147 = 0;
                uVar226 = 0;
                uVar227 = 0;
                fVar163 = (float)local_6e0._0_4_ -
                          (fVar133 * (fVar163 / fVar167) - fVar165 * (auVar66._0_4_ / fVar167));
                auVar207 = ZEXT464((uint)fVar163);
                auVar23._8_4_ = 0x7fffffff;
                auVar23._0_8_ = 0x7fffffff7fffffff;
                auVar23._12_4_ = 0x7fffffff;
                auVar68 = vandps_avx512vl(auVar69,auVar23);
              } while (auVar75._0_4_ <= auVar68._0_4_);
              auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ + auVar76._0_4_)),local_600,
                                        ZEXT416(0x36000000));
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar66 = vandps_avx512vl(ZEXT416((uint)fVar133),auVar24);
            } while (auVar68._0_4_ <= auVar66._0_4_);
            fVar163 = fVar163 + (float)local_610._0_4_;
            if ((((fVar237 <= fVar163) &&
                 (fVar161 = *(float *)(ray + k * 4 + 0x80), fVar163 <= fVar161)) && (0.0 <= fVar132)
                ) && (fVar132 <= 1.0)) {
              auVar178._4_12_ = SUB1612(ZEXT816(0),0);
              auVar178._0_4_ = local_840._0_4_;
              auVar68 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar178);
              fVar165 = auVar68._0_4_;
              pGVar7 = (context->scene->geometries).items[uVar5].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar165 = fVar165 * 1.5 + local_840._0_4_ * -0.5 * fVar165 * fVar165 * fVar165;
                auVar179._0_4_ = local_6c0._0_4_ * fVar165;
                auVar179._4_4_ = local_6c0._4_4_ * fVar165;
                auVar179._8_4_ = local_6c0._8_4_ * fVar165;
                auVar179._12_4_ = local_6c0._12_4_ * fVar165;
                auVar66 = vfmadd213ps_fma(auVar71,auVar179,auVar70);
                auVar68 = vshufps_avx(auVar179,auVar179,0xc9);
                auVar71 = vshufps_avx(auVar70,auVar70,0xc9);
                auVar180._0_4_ = auVar179._0_4_ * auVar71._0_4_;
                auVar180._4_4_ = auVar179._4_4_ * auVar71._4_4_;
                auVar180._8_4_ = auVar179._8_4_ * auVar71._8_4_;
                auVar180._12_4_ = auVar179._12_4_ * auVar71._12_4_;
                auVar71 = vfmsub231ps_fma(auVar180,auVar70,auVar68);
                auVar68 = vshufps_avx(auVar71,auVar71,0xc9);
                auVar70 = vshufps_avx(auVar66,auVar66,0xc9);
                auVar71 = vshufps_avx(auVar71,auVar71,0xd2);
                auVar136._0_4_ = auVar66._0_4_ * auVar71._0_4_;
                auVar136._4_4_ = auVar66._4_4_ * auVar71._4_4_;
                auVar136._8_4_ = auVar66._8_4_ * auVar71._8_4_;
                auVar136._12_4_ = auVar66._12_4_ * auVar71._12_4_;
                auVar68 = vfmsub231ps_fma(auVar136,auVar68,auVar70);
                uVar147 = auVar68._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar163;
                  uVar226 = vextractps_avx(auVar68,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar226;
                  uVar226 = vextractps_avx(auVar68,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar226;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar147;
                  *(float *)(ray + k * 4 + 0xf0) = fVar132;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = uVar6;
                  *(uint *)(ray + k * 4 + 0x120) = uVar5;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar68,auVar68,0x55);
                  auStack_450 = vshufps_avx(auVar68,auVar68,0xaa);
                  local_440 = uVar147;
                  uStack_43c = uVar147;
                  uStack_438 = uVar147;
                  uStack_434 = uVar147;
                  local_430 = fVar132;
                  fStack_42c = fVar132;
                  fStack_428 = fVar132;
                  fStack_424 = fVar132;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar163;
                  local_8a0 = local_490;
                  local_810.valid = (int *)local_8a0;
                  local_810.geometryUserPtr = pGVar7->userPtr;
                  local_810.context = context->user;
                  local_810.hit = local_460;
                  local_810.N = 4;
                  local_880._0_4_ = fVar161;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar238 = ZEXT1664(auVar69);
                    (*pGVar7->intersectionFilterN)(&local_810);
                    fVar161 = (float)local_880._0_4_;
                  }
                  uVar61 = vptestmd_avx512vl(local_8a0,local_8a0);
                  if ((uVar61 & 0xf) != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar238 = ZEXT1664(auVar238._0_16_);
                      (*p_Var8)(&local_810);
                      fVar161 = (float)local_880._0_4_;
                    }
                    uVar61 = vptestmd_avx512vl(local_8a0,local_8a0);
                    uVar61 = uVar61 & 0xf;
                    bVar59 = (byte)uVar61;
                    if (bVar59 != 0) {
                      iVar3 = *(int *)(local_810.hit + 4);
                      iVar4 = *(int *)(local_810.hit + 8);
                      iVar1 = *(int *)(local_810.hit + 0xc);
                      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar61 >> 2) & 1);
                      bVar10 = SUB81(uVar61 >> 3,0);
                      *(uint *)(local_810.ray + 0xc0) =
                           (uint)(bVar59 & 1) * *(int *)local_810.hit |
                           (uint)!(bool)(bVar59 & 1) * *(int *)(local_810.ray + 0xc0);
                      *(uint *)(local_810.ray + 0xc4) =
                           (uint)bVar62 * iVar3 | (uint)!bVar62 * *(int *)(local_810.ray + 0xc4);
                      *(uint *)(local_810.ray + 200) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_810.ray + 200);
                      *(uint *)(local_810.ray + 0xcc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_810.ray + 0xcc);
                      iVar3 = *(int *)(local_810.hit + 0x14);
                      iVar4 = *(int *)(local_810.hit + 0x18);
                      iVar1 = *(int *)(local_810.hit + 0x1c);
                      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar61 >> 2) & 1);
                      bVar10 = SUB81(uVar61 >> 3,0);
                      *(uint *)(local_810.ray + 0xd0) =
                           (uint)(bVar59 & 1) * *(int *)(local_810.hit + 0x10) |
                           (uint)!(bool)(bVar59 & 1) * *(int *)(local_810.ray + 0xd0);
                      *(uint *)(local_810.ray + 0xd4) =
                           (uint)bVar62 * iVar3 | (uint)!bVar62 * *(int *)(local_810.ray + 0xd4);
                      *(uint *)(local_810.ray + 0xd8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_810.ray + 0xd8);
                      *(uint *)(local_810.ray + 0xdc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_810.ray + 0xdc);
                      iVar3 = *(int *)(local_810.hit + 0x24);
                      iVar4 = *(int *)(local_810.hit + 0x28);
                      iVar1 = *(int *)(local_810.hit + 0x2c);
                      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar61 >> 2) & 1);
                      bVar10 = SUB81(uVar61 >> 3,0);
                      *(uint *)(local_810.ray + 0xe0) =
                           (uint)(bVar59 & 1) * *(int *)(local_810.hit + 0x20) |
                           (uint)!(bool)(bVar59 & 1) * *(int *)(local_810.ray + 0xe0);
                      *(uint *)(local_810.ray + 0xe4) =
                           (uint)bVar62 * iVar3 | (uint)!bVar62 * *(int *)(local_810.ray + 0xe4);
                      *(uint *)(local_810.ray + 0xe8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_810.ray + 0xe8);
                      *(uint *)(local_810.ray + 0xec) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_810.ray + 0xec);
                      iVar3 = *(int *)(local_810.hit + 0x34);
                      iVar4 = *(int *)(local_810.hit + 0x38);
                      iVar1 = *(int *)(local_810.hit + 0x3c);
                      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar61 >> 2) & 1);
                      bVar10 = SUB81(uVar61 >> 3,0);
                      *(uint *)(local_810.ray + 0xf0) =
                           (uint)(bVar59 & 1) * *(int *)(local_810.hit + 0x30) |
                           (uint)!(bool)(bVar59 & 1) * *(int *)(local_810.ray + 0xf0);
                      *(uint *)(local_810.ray + 0xf4) =
                           (uint)bVar62 * iVar3 | (uint)!bVar62 * *(int *)(local_810.ray + 0xf4);
                      *(uint *)(local_810.ray + 0xf8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_810.ray + 0xf8);
                      *(uint *)(local_810.ray + 0xfc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_810.ray + 0xfc);
                      iVar3 = *(int *)(local_810.hit + 0x44);
                      iVar4 = *(int *)(local_810.hit + 0x48);
                      iVar1 = *(int *)(local_810.hit + 0x4c);
                      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar61 >> 2) & 1);
                      bVar10 = SUB81(uVar61 >> 3,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)(bVar59 & 1) * *(int *)(local_810.hit + 0x40) |
                           (uint)!(bool)(bVar59 & 1) * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar62 * iVar3 | (uint)!bVar62 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_810.ray + 0x10c);
                      auVar68 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x50));
                      *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar68;
                      auVar68 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x60));
                      *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar68;
                      auVar68 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x70));
                      *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar68;
                      auVar68 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x80));
                      *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar68;
                      goto LAB_01a74878;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar161;
                }
              }
            }
LAB_01a74878:
            uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar212._4_4_ = uVar147;
            auVar212._0_4_ = uVar147;
            auVar212._8_4_ = uVar147;
            auVar212._12_4_ = uVar147;
            auVar212._16_4_ = uVar147;
            auVar212._20_4_ = uVar147;
            auVar212._24_4_ = uVar147;
            auVar212._28_4_ = uVar147;
            auVar207 = ZEXT3264(auVar212);
            auVar52._4_4_ = fStack_31c;
            auVar52._0_4_ = local_320;
            auVar52._8_4_ = fStack_318;
            auVar52._12_4_ = fStack_314;
            auVar52._16_4_ = fStack_310;
            auVar52._20_4_ = fStack_30c;
            auVar52._24_4_ = fStack_308;
            auVar52._28_4_ = fStack_304;
            uVar16 = vcmpps_avx512vl(auVar212,auVar52,0xd);
          }
          auVar142._0_4_ = (float)local_680._0_4_ + (float)local_340._0_4_;
          auVar142._4_4_ = (float)local_680._4_4_ + (float)local_340._4_4_;
          auVar142._8_4_ = fStack_678 + fStack_338;
          auVar142._12_4_ = fStack_674 + fStack_334;
          auVar142._16_4_ = fStack_670 + fStack_330;
          auVar142._20_4_ = fStack_66c + fStack_32c;
          auVar142._24_4_ = fStack_668 + fStack_328;
          auVar142._28_4_ = fStack_664 + fStack_324;
          uVar147 = auVar207._0_4_;
          auVar157._4_4_ = uVar147;
          auVar157._0_4_ = uVar147;
          auVar157._8_4_ = uVar147;
          auVar157._12_4_ = uVar147;
          auVar157._16_4_ = uVar147;
          auVar157._20_4_ = uVar147;
          auVar157._24_4_ = uVar147;
          auVar157._28_4_ = uVar147;
          uVar16 = vcmpps_avx512vl(auVar142,auVar157,2);
          auVar143._8_4_ = 2;
          auVar143._0_8_ = 0x200000002;
          auVar143._12_4_ = 2;
          auVar143._16_4_ = 2;
          auVar143._20_4_ = 2;
          auVar143._24_4_ = 2;
          auVar143._28_4_ = 2;
          auVar33._8_4_ = 3;
          auVar33._0_8_ = 0x300000003;
          auVar33._12_4_ = 3;
          auVar33._16_4_ = 3;
          auVar33._20_4_ = 3;
          auVar33._24_4_ = 3;
          auVar33._28_4_ = 3;
          auVar90 = vpblendmd_avx512vl(auVar143,auVar33);
          bVar62 = (bool)((byte)local_890 & 1);
          local_340._0_4_ = (uint)bVar62 * auVar90._0_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)((byte)(local_890 >> 1) & 1);
          local_340._4_4_ = (uint)bVar62 * auVar90._4_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)((byte)(local_890 >> 2) & 1);
          fStack_338 = (float)((uint)bVar62 * auVar90._8_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)((byte)(local_890 >> 3) & 1);
          fStack_334 = (float)((uint)bVar62 * auVar90._12_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)((byte)(local_890 >> 4) & 1);
          fStack_330 = (float)((uint)bVar62 * auVar90._16_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)((byte)(local_890 >> 5) & 1);
          fStack_32c = (float)((uint)bVar62 * auVar90._20_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)((byte)(local_890 >> 6) & 1);
          fStack_328 = (float)((uint)bVar62 * auVar90._24_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)((byte)(local_890 >> 7) & 1);
          fStack_324 = (float)((uint)bVar62 * auVar90._28_4_ | (uint)!bVar62 * 2);
          bVar55 = (byte)uVar18 & bVar55 & (byte)uVar16;
          uVar16 = vpcmpd_avx512vl(_local_340,local_2e0,2);
          local_360 = _local_2c0;
          local_320 = (float)local_680._0_4_ + (float)local_2c0._0_4_;
          fStack_31c = (float)local_680._4_4_ + (float)local_2c0._4_4_;
          fStack_318 = fStack_678 + fStack_2b8;
          fStack_314 = fStack_674 + fStack_2b4;
          fStack_310 = fStack_670 + fStack_2b0;
          fStack_30c = fStack_66c + fStack_2ac;
          fStack_308 = fStack_668 + fStack_2a8;
          fStack_304 = fStack_664 + fStack_2a4;
          auVar239 = ZEXT3264(local_740);
          auVar240 = ZEXT3264(local_760);
          auVar234 = ZEXT3264(local_780);
          auVar223 = ZEXT3264(local_700);
          auVar220 = ZEXT3264(local_720);
          auVar225 = ZEXT3264(local_7a0);
          auVar230 = ZEXT3264(local_7c0);
          for (bVar59 = (byte)uVar16 & bVar55; auVar90 = _local_860, bVar59 != 0;
              bVar59 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar59 & (byte)uVar16) {
            auVar144._8_4_ = 0x7f800000;
            auVar144._0_8_ = 0x7f8000007f800000;
            auVar144._12_4_ = 0x7f800000;
            auVar144._16_4_ = 0x7f800000;
            auVar144._20_4_ = 0x7f800000;
            auVar144._24_4_ = 0x7f800000;
            auVar144._28_4_ = 0x7f800000;
            auVar79 = vblendmps_avx512vl(auVar144,local_360);
            auVar123._0_4_ =
                 (uint)(bVar59 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 1 & 1);
            auVar123._4_4_ = (uint)bVar62 * auVar79._4_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 2 & 1);
            auVar123._8_4_ = (uint)bVar62 * auVar79._8_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 3 & 1);
            auVar123._12_4_ = (uint)bVar62 * auVar79._12_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 4 & 1);
            auVar123._16_4_ = (uint)bVar62 * auVar79._16_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 5 & 1);
            auVar123._20_4_ = (uint)bVar62 * auVar79._20_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 6 & 1);
            auVar123._24_4_ = (uint)bVar62 * auVar79._24_4_ | (uint)!bVar62 * 0x7f800000;
            auVar123._28_4_ =
                 (uint)(bVar59 >> 7) * auVar79._28_4_ | (uint)!(bool)(bVar59 >> 7) * 0x7f800000;
            auVar79 = vshufps_avx(auVar123,auVar123,0xb1);
            auVar79 = vminps_avx(auVar123,auVar79);
            auVar77 = vshufpd_avx(auVar79,auVar79,5);
            auVar79 = vminps_avx(auVar79,auVar77);
            auVar77 = vpermpd_avx2(auVar79,0x4e);
            auVar79 = vminps_avx(auVar79,auVar77);
            uVar16 = vcmpps_avx512vl(auVar123,auVar79,0);
            bVar56 = (byte)uVar16 & bVar59;
            bVar57 = bVar59;
            if (bVar56 != 0) {
              bVar57 = bVar56;
            }
            iVar2 = 0;
            for (uVar65 = (uint)bVar57; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            auVar238 = ZEXT464(*(uint *)(local_2a0 + (uint)(iVar2 << 2)));
            fVar161 = local_884;
            fVar132 = *(float *)(local_1c0 + (uint)(iVar2 << 2));
            uVar147 = 0;
            uVar226 = 0;
            uVar227 = 0;
            if ((float)local_6a0._0_4_ < 0.0) {
              local_840._0_16_ = ZEXT416((uint)*(float *)(local_1c0 + (uint)(iVar2 << 2)));
              local_880._0_16_ = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar2 << 2)));
              local_860[1] = 0;
              local_860[0] = bVar59;
              stack0xfffffffffffff7a2 = auVar90._2_30_;
              fVar161 = sqrtf((float)local_6a0._0_4_);
              bVar59 = local_860[0];
              auVar238 = ZEXT1664(local_880._0_16_);
              auVar230 = ZEXT3264(local_7c0);
              auVar225 = ZEXT3264(local_7a0);
              auVar220 = ZEXT3264(local_720);
              auVar223 = ZEXT3264(local_700);
              auVar234 = ZEXT3264(local_780);
              auVar240 = ZEXT3264(local_760);
              auVar239 = ZEXT3264(local_740);
              fVar132 = (float)local_840._0_4_;
              uVar147 = local_840._4_4_;
              uVar226 = local_840._8_4_;
              uVar227 = local_840._12_4_;
            }
            auVar69 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar68 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar70 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar71 = vminps_avx(auVar69,auVar70);
            auVar69 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar70 = vmaxps_avx(auVar68,auVar69);
            auVar197._8_4_ = 0x7fffffff;
            auVar197._0_8_ = 0x7fffffff7fffffff;
            auVar197._12_4_ = 0x7fffffff;
            auVar68 = vandps_avx(auVar71,auVar197);
            auVar69 = vandps_avx(auVar70,auVar197);
            auVar68 = vmaxps_avx(auVar68,auVar69);
            auVar69 = vmovshdup_avx(auVar68);
            auVar69 = vmaxss_avx(auVar69,auVar68);
            auVar68 = vshufpd_avx(auVar68,auVar68,1);
            auVar68 = vmaxss_avx(auVar68,auVar69);
            fVar163 = auVar68._0_4_ * 1.9073486e-06;
            local_7e0._0_4_ = fVar161 * 1.9073486e-06;
            local_600 = vshufps_avx(auVar70,auVar70,0xff);
            lVar58 = 5;
            do {
              do {
                auVar90 = local_840;
                bVar62 = lVar58 == 0;
                lVar58 = lVar58 + -1;
                if (bVar62) goto LAB_01a754ea;
                uVar228 = auVar238._0_4_;
                auVar137._4_4_ = uVar228;
                auVar137._0_4_ = uVar228;
                auVar137._8_4_ = uVar228;
                auVar137._12_4_ = uVar228;
                auVar69 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_690);
                fVar161 = 1.0 - fVar132;
                auVar181._0_4_ = local_5a0._0_4_ * fVar132;
                auVar181._4_4_ = local_5a0._4_4_ * fVar132;
                auVar181._8_4_ = local_5a0._8_4_ * fVar132;
                auVar181._12_4_ = local_5a0._12_4_ * fVar132;
                local_4e0._0_16_ = ZEXT416((uint)fVar161);
                auVar198._4_4_ = fVar161;
                auVar198._0_4_ = fVar161;
                auVar198._8_4_ = fVar161;
                auVar198._12_4_ = fVar161;
                auVar68 = vfmadd231ps_fma(auVar181,auVar198,local_560._0_16_);
                auVar203._0_4_ = local_580._0_4_ * fVar132;
                auVar203._4_4_ = local_580._4_4_ * fVar132;
                auVar203._8_4_ = local_580._8_4_ * fVar132;
                auVar203._12_4_ = local_580._12_4_ * fVar132;
                auVar70 = vfmadd231ps_fma(auVar203,auVar198,local_5a0._0_16_);
                auVar210._0_4_ = fVar132 * (float)local_5c0._0_4_;
                auVar210._4_4_ = fVar132 * (float)local_5c0._4_4_;
                auVar210._8_4_ = fVar132 * fStack_5b8;
                auVar210._12_4_ = fVar132 * fStack_5b4;
                auVar71 = vfmadd231ps_fma(auVar210,auVar198,local_580._0_16_);
                auVar218._0_4_ = fVar132 * auVar70._0_4_;
                auVar218._4_4_ = fVar132 * auVar70._4_4_;
                auVar218._8_4_ = fVar132 * auVar70._8_4_;
                auVar218._12_4_ = fVar132 * auVar70._12_4_;
                auVar68 = vfmadd231ps_fma(auVar218,auVar198,auVar68);
                auVar182._0_4_ = fVar132 * auVar71._0_4_;
                auVar182._4_4_ = fVar132 * auVar71._4_4_;
                auVar182._8_4_ = fVar132 * auVar71._8_4_;
                auVar182._12_4_ = fVar132 * auVar71._12_4_;
                auVar70 = vfmadd231ps_fma(auVar182,auVar198,auVar70);
                auVar204._0_4_ = fVar132 * auVar70._0_4_;
                auVar204._4_4_ = fVar132 * auVar70._4_4_;
                auVar204._8_4_ = fVar132 * auVar70._8_4_;
                auVar204._12_4_ = fVar132 * auVar70._12_4_;
                auVar71 = vfmadd231ps_fma(auVar204,auVar68,auVar198);
                auVar68 = vsubps_avx(auVar70,auVar68);
                auVar25._8_4_ = 0x40400000;
                auVar25._0_8_ = 0x4040000040400000;
                auVar25._12_4_ = 0x40400000;
                auVar68 = vmulps_avx512vl(auVar68,auVar25);
                _local_860 = auVar68;
                _local_4c0 = auVar71;
                auVar68 = vsubps_avx(auVar69,auVar71);
                _local_6c0 = auVar68;
                auVar68 = vdpps_avx(auVar68,auVar68,0x7f);
                local_6e0._0_16_ = auVar68;
                local_840._4_4_ = uVar147;
                local_840._0_4_ = fVar132;
                local_840._8_4_ = uVar226;
                local_840._16_16_ = auVar90._16_16_;
                local_840._12_4_ = uVar227;
                local_880._0_16_ = auVar238._0_16_;
                if (auVar68._0_4_ < 0.0) {
                  auVar234._0_4_ = sqrtf(auVar68._0_4_);
                  auVar234._4_60_ = extraout_var_01;
                  auVar68 = auVar234._0_16_;
                }
                else {
                  auVar68 = vsqrtss_avx(auVar68,auVar68);
                }
                local_500._0_16_ = vdpps_avx(_local_860,_local_860,0x7f);
                fVar132 = local_500._0_4_;
                auVar183._4_12_ = ZEXT812(0) << 0x20;
                auVar183._0_4_ = fVar132;
                local_660._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar183);
                fVar161 = local_660._0_4_;
                local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar183);
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar70 = vxorps_avx512vl(local_500._0_16_,auVar26);
                auVar69 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
                local_540._0_4_ = auVar69._0_4_;
                local_640._0_4_ = auVar68._0_4_;
                if (fVar132 < auVar70._0_4_) {
                  fVar165 = sqrtf(fVar132);
                  auVar68 = ZEXT416((uint)local_640._0_4_);
                }
                else {
                  auVar69 = vsqrtss_avx(local_500._0_16_,local_500._0_16_);
                  fVar165 = auVar69._0_4_;
                }
                fVar133 = local_660._0_4_;
                fVar132 = fVar161 * 1.5 + fVar132 * -0.5 * fVar133 * fVar133 * fVar133;
                auVar235._0_4_ = fVar132 * (float)local_860._0_4_;
                auVar235._4_4_ = fVar132 * (float)local_860._4_4_;
                auVar235._8_4_ = fVar132 * fStack_858;
                auVar235._12_4_ = fVar132 * fStack_854;
                local_660._0_16_ = vdpps_avx(auVar235,_local_6c0,0x7f);
                auVar71 = vaddss_avx512f(auVar68,ZEXT416(0x3f800000));
                auVar138._0_4_ = local_660._0_4_ * local_660._0_4_;
                auVar138._4_4_ = local_660._4_4_ * local_660._4_4_;
                auVar138._8_4_ = local_660._8_4_ * local_660._8_4_;
                auVar138._12_4_ = local_660._12_4_ * local_660._12_4_;
                auVar69 = vsubps_avx(local_6e0._0_16_,auVar138);
                fVar161 = auVar69._0_4_;
                auVar152._4_12_ = ZEXT812(0) << 0x20;
                auVar152._0_4_ = fVar161;
                auVar70 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar152);
                auVar66 = vmulss_avx512f(auVar70,ZEXT416(0x3fc00000));
                auVar72 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
                uVar64 = fVar161 == 0.0;
                uVar63 = fVar161 < 0.0;
                if ((bool)uVar63) {
                  local_5f0 = fVar132;
                  fStack_5ec = fVar132;
                  fStack_5e8 = fVar132;
                  fStack_5e4 = fVar132;
                  local_5e0 = auVar235;
                  local_5d0 = auVar70;
                  fVar161 = sqrtf(fVar161);
                  auVar72 = ZEXT416(auVar72._0_4_);
                  auVar66 = ZEXT416(auVar66._0_4_);
                  auVar68 = ZEXT416((uint)local_640._0_4_);
                  auVar71 = ZEXT416(auVar71._0_4_);
                  auVar235 = local_5e0;
                  auVar70 = local_5d0;
                  fVar132 = local_5f0;
                  fVar133 = fStack_5ec;
                  fVar167 = fStack_5e8;
                  fVar169 = fStack_5e4;
                }
                else {
                  auVar69 = vsqrtss_avx(auVar69,auVar69);
                  fVar161 = auVar69._0_4_;
                  fVar133 = fVar132;
                  fVar167 = fVar132;
                  fVar169 = fVar132;
                }
                auVar239 = ZEXT3264(local_740);
                auVar240 = ZEXT3264(local_760);
                auVar234 = ZEXT3264(local_780);
                auVar225 = ZEXT3264(local_7a0);
                auVar230 = ZEXT3264(local_7c0);
                auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_840._0_16_,
                                          local_4e0._0_16_);
                fVar194 = auVar69._0_4_ * 6.0;
                fVar146 = local_840._0_4_ * 6.0;
                auVar184._0_4_ = fVar146 * (float)local_5c0._0_4_;
                auVar184._4_4_ = fVar146 * (float)local_5c0._4_4_;
                auVar184._8_4_ = fVar146 * fStack_5b8;
                auVar184._12_4_ = fVar146 * fStack_5b4;
                auVar153._4_4_ = fVar194;
                auVar153._0_4_ = fVar194;
                auVar153._8_4_ = fVar194;
                auVar153._12_4_ = fVar194;
                auVar69 = vfmadd132ps_fma(auVar153,auVar184,local_580._0_16_);
                auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                          local_840._0_16_);
                fVar194 = auVar73._0_4_ * 6.0;
                auVar185._4_4_ = fVar194;
                auVar185._0_4_ = fVar194;
                auVar185._8_4_ = fVar194;
                auVar185._12_4_ = fVar194;
                auVar69 = vfmadd132ps_fma(auVar185,auVar69,local_5a0._0_16_);
                fVar194 = local_4e0._0_4_ * 6.0;
                auVar154._4_4_ = fVar194;
                auVar154._0_4_ = fVar194;
                auVar154._8_4_ = fVar194;
                auVar154._12_4_ = fVar194;
                auVar69 = vfmadd132ps_fma(auVar154,auVar69,local_560._0_16_);
                auVar186._0_4_ = auVar69._0_4_ * (float)local_500._0_4_;
                auVar186._4_4_ = auVar69._4_4_ * (float)local_500._0_4_;
                auVar186._8_4_ = auVar69._8_4_ * (float)local_500._0_4_;
                auVar186._12_4_ = auVar69._12_4_ * (float)local_500._0_4_;
                auVar69 = vdpps_avx(_local_860,auVar69,0x7f);
                fVar194 = auVar69._0_4_;
                auVar155._0_4_ = local_860._0_4_ * fVar194;
                auVar155._4_4_ = local_860._4_4_ * fVar194;
                auVar155._8_4_ = local_860._8_4_ * fVar194;
                auVar155._12_4_ = local_860._12_4_ * fVar194;
                auVar69 = vsubps_avx(auVar186,auVar155);
                fVar194 = (float)local_540._0_4_ * (float)local_520._0_4_;
                auVar27._8_4_ = 0x80000000;
                auVar27._0_8_ = 0x8000000080000000;
                auVar27._12_4_ = 0x80000000;
                auVar76 = vxorps_avx512vl(_local_860,auVar27);
                auVar205._0_4_ = fVar132 * auVar69._0_4_ * fVar194;
                auVar205._4_4_ = fVar133 * auVar69._4_4_ * fVar194;
                auVar205._8_4_ = fVar167 * auVar69._8_4_ * fVar194;
                auVar205._12_4_ = fVar169 * auVar69._12_4_ * fVar194;
                auVar69 = vdpps_avx(auVar76,auVar235,0x7f);
                auVar67 = vmaxss_avx(ZEXT416((uint)fVar163),
                                     ZEXT416((uint)((float)local_880._0_4_ * (float)local_7e0._0_4_)
                                            ));
                auVar73 = vdpps_avx(_local_6c0,auVar205,0x7f);
                auVar68 = vfmadd213ss_fma(auVar68,ZEXT416((uint)fVar163),auVar67);
                vfmadd213ss_avx512f(auVar71,ZEXT416((uint)(fVar163 / fVar165)),auVar68);
                auVar68 = vdpps_avx(local_690,auVar235,0x7f);
                fVar165 = auVar69._0_4_ + auVar73._0_4_;
                auVar69 = vdpps_avx(_local_6c0,auVar76,0x7f);
                auVar71 = vmulss_avx512f(auVar72,auVar70);
                auVar72 = vmulss_avx512f(auVar70,auVar70);
                auVar70 = vdpps_avx(_local_6c0,local_690,0x7f);
                auVar72 = vaddss_avx512f(auVar66,ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_)));
                auVar71 = vfnmadd231ss_fma(auVar69,local_660._0_16_,ZEXT416((uint)fVar165));
                auVar66 = vfnmadd231ss_fma(auVar70,local_660._0_16_,auVar68);
                auVar69 = vpermilps_avx(_local_4c0,0xff);
                fVar161 = fVar161 - auVar69._0_4_;
                auVar69 = vshufps_avx(_local_860,_local_860,0xff);
                auVar70 = vfmsub213ss_fma(auVar71,auVar72,auVar69);
                fVar132 = auVar66._0_4_ * auVar72._0_4_;
                auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar68._0_4_ * auVar70._0_4_)),
                                          ZEXT416((uint)fVar165),ZEXT416((uint)fVar132));
                fVar133 = auVar71._0_4_;
                fVar132 = local_840._0_4_ -
                          (local_660._0_4_ * (fVar132 / fVar133) -
                          fVar161 * (auVar68._0_4_ / fVar133));
                uVar147 = 0;
                uVar226 = 0;
                uVar227 = 0;
                fVar165 = (float)local_880._0_4_ -
                          (fVar161 * (fVar165 / fVar133) -
                          local_660._0_4_ * (auVar70._0_4_ / fVar133));
                auVar238 = ZEXT464((uint)fVar165);
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar68 = vandps_avx512vl(local_660._0_16_,auVar28);
                auVar68 = vucomiss_avx512f(auVar68);
                auVar223 = ZEXT3264(local_700);
                auVar220 = ZEXT3264(local_720);
              } while ((bool)uVar63 || (bool)uVar64);
              auVar68 = vaddss_avx512f(auVar67,auVar68);
              auVar68 = vfmadd231ss_fma(auVar68,local_600,ZEXT416(0x36000000));
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar70 = vandps_avx512vl(ZEXT416((uint)fVar161),auVar29);
            } while (auVar68._0_4_ <= auVar70._0_4_);
            fVar161 = fVar165 + (float)local_610._0_4_;
            if ((((fVar237 <= fVar161) &&
                 (fVar163 = *(float *)(ray + k * 4 + 0x80), fVar161 <= fVar163)) && (0.0 <= fVar132)
                ) && (fVar132 <= 1.0)) {
              auVar187._4_12_ = SUB1612(ZEXT816(0),0);
              auVar187._0_4_ = local_6e0._0_4_;
              auVar68 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar187);
              fVar133 = auVar68._0_4_;
              pGVar7 = (context->scene->geometries).items[uVar5].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar133 = fVar133 * 1.5 +
                          (float)local_6e0._0_4_ * -0.5 * fVar133 * fVar133 * fVar133;
                auVar188._0_4_ = fVar133 * (float)local_6c0._0_4_;
                auVar188._4_4_ = fVar133 * (float)local_6c0._4_4_;
                auVar188._8_4_ = fVar133 * fStack_6b8;
                auVar188._12_4_ = fVar133 * fStack_6b4;
                auVar71 = vfmadd213ps_fma(auVar69,auVar188,_local_860);
                auVar68 = vshufps_avx(auVar188,auVar188,0xc9);
                auVar69 = vshufps_avx(_local_860,_local_860,0xc9);
                auVar189._0_4_ = auVar188._0_4_ * auVar69._0_4_;
                auVar189._4_4_ = auVar188._4_4_ * auVar69._4_4_;
                auVar189._8_4_ = auVar188._8_4_ * auVar69._8_4_;
                auVar189._12_4_ = auVar188._12_4_ * auVar69._12_4_;
                auVar70 = vfmsub231ps_fma(auVar189,_local_860,auVar68);
                auVar68 = vshufps_avx(auVar70,auVar70,0xc9);
                auVar69 = vshufps_avx(auVar71,auVar71,0xc9);
                auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                auVar139._0_4_ = auVar71._0_4_ * auVar70._0_4_;
                auVar139._4_4_ = auVar71._4_4_ * auVar70._4_4_;
                auVar139._8_4_ = auVar71._8_4_ * auVar70._8_4_;
                auVar139._12_4_ = auVar71._12_4_ * auVar70._12_4_;
                auVar68 = vfmsub231ps_fma(auVar139,auVar68,auVar69);
                uVar147 = auVar68._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar161;
                  uVar226 = vextractps_avx(auVar68,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar226;
                  uVar226 = vextractps_avx(auVar68,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar226;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar147;
                  *(float *)(ray + k * 4 + 0xf0) = fVar132;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = uVar6;
                  *(uint *)(ray + k * 4 + 0x120) = uVar5;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar68,auVar68,0x55);
                  auStack_450 = vshufps_avx(auVar68,auVar68,0xaa);
                  local_440 = uVar147;
                  uStack_43c = uVar147;
                  uStack_438 = uVar147;
                  uStack_434 = uVar147;
                  local_430 = fVar132;
                  fStack_42c = fVar132;
                  fStack_428 = fVar132;
                  fStack_424 = fVar132;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar161;
                  local_8a0 = local_490;
                  local_810.valid = (int *)local_8a0;
                  local_810.geometryUserPtr = pGVar7->userPtr;
                  local_810.context = context->user;
                  local_810.hit = local_460;
                  local_810.N = 4;
                  local_840._0_4_ = fVar163;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar238 = ZEXT464((uint)fVar165);
                    (*pGVar7->intersectionFilterN)(&local_810);
                    auVar230 = ZEXT3264(local_7c0);
                    auVar225 = ZEXT3264(local_7a0);
                    auVar220 = ZEXT3264(local_720);
                    auVar223 = ZEXT3264(local_700);
                    auVar234 = ZEXT3264(local_780);
                    auVar240 = ZEXT3264(local_760);
                    auVar239 = ZEXT3264(local_740);
                    fVar163 = (float)local_840._0_4_;
                  }
                  uVar61 = vptestmd_avx512vl(local_8a0,local_8a0);
                  if ((uVar61 & 0xf) != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar238 = ZEXT1664(auVar238._0_16_);
                      (*p_Var8)(&local_810);
                      auVar230 = ZEXT3264(local_7c0);
                      auVar225 = ZEXT3264(local_7a0);
                      auVar220 = ZEXT3264(local_720);
                      auVar223 = ZEXT3264(local_700);
                      auVar234 = ZEXT3264(local_780);
                      auVar240 = ZEXT3264(local_760);
                      auVar239 = ZEXT3264(local_740);
                      fVar163 = (float)local_840._0_4_;
                    }
                    uVar61 = vptestmd_avx512vl(local_8a0,local_8a0);
                    uVar61 = uVar61 & 0xf;
                    bVar57 = (byte)uVar61;
                    if (bVar57 != 0) {
                      iVar3 = *(int *)(local_810.hit + 4);
                      iVar4 = *(int *)(local_810.hit + 8);
                      iVar1 = *(int *)(local_810.hit + 0xc);
                      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar61 >> 2) & 1);
                      bVar10 = SUB81(uVar61 >> 3,0);
                      *(uint *)(local_810.ray + 0xc0) =
                           (uint)(bVar57 & 1) * *(int *)local_810.hit |
                           (uint)!(bool)(bVar57 & 1) * *(int *)(local_810.ray + 0xc0);
                      *(uint *)(local_810.ray + 0xc4) =
                           (uint)bVar62 * iVar3 | (uint)!bVar62 * *(int *)(local_810.ray + 0xc4);
                      *(uint *)(local_810.ray + 200) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_810.ray + 200);
                      *(uint *)(local_810.ray + 0xcc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_810.ray + 0xcc);
                      iVar3 = *(int *)(local_810.hit + 0x14);
                      iVar4 = *(int *)(local_810.hit + 0x18);
                      iVar1 = *(int *)(local_810.hit + 0x1c);
                      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar61 >> 2) & 1);
                      bVar10 = SUB81(uVar61 >> 3,0);
                      *(uint *)(local_810.ray + 0xd0) =
                           (uint)(bVar57 & 1) * *(int *)(local_810.hit + 0x10) |
                           (uint)!(bool)(bVar57 & 1) * *(int *)(local_810.ray + 0xd0);
                      *(uint *)(local_810.ray + 0xd4) =
                           (uint)bVar62 * iVar3 | (uint)!bVar62 * *(int *)(local_810.ray + 0xd4);
                      *(uint *)(local_810.ray + 0xd8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_810.ray + 0xd8);
                      *(uint *)(local_810.ray + 0xdc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_810.ray + 0xdc);
                      iVar3 = *(int *)(local_810.hit + 0x24);
                      iVar4 = *(int *)(local_810.hit + 0x28);
                      iVar1 = *(int *)(local_810.hit + 0x2c);
                      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar61 >> 2) & 1);
                      bVar10 = SUB81(uVar61 >> 3,0);
                      *(uint *)(local_810.ray + 0xe0) =
                           (uint)(bVar57 & 1) * *(int *)(local_810.hit + 0x20) |
                           (uint)!(bool)(bVar57 & 1) * *(int *)(local_810.ray + 0xe0);
                      *(uint *)(local_810.ray + 0xe4) =
                           (uint)bVar62 * iVar3 | (uint)!bVar62 * *(int *)(local_810.ray + 0xe4);
                      *(uint *)(local_810.ray + 0xe8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_810.ray + 0xe8);
                      *(uint *)(local_810.ray + 0xec) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_810.ray + 0xec);
                      iVar3 = *(int *)(local_810.hit + 0x34);
                      iVar4 = *(int *)(local_810.hit + 0x38);
                      iVar1 = *(int *)(local_810.hit + 0x3c);
                      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar61 >> 2) & 1);
                      bVar10 = SUB81(uVar61 >> 3,0);
                      *(uint *)(local_810.ray + 0xf0) =
                           (uint)(bVar57 & 1) * *(int *)(local_810.hit + 0x30) |
                           (uint)!(bool)(bVar57 & 1) * *(int *)(local_810.ray + 0xf0);
                      *(uint *)(local_810.ray + 0xf4) =
                           (uint)bVar62 * iVar3 | (uint)!bVar62 * *(int *)(local_810.ray + 0xf4);
                      *(uint *)(local_810.ray + 0xf8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_810.ray + 0xf8);
                      *(uint *)(local_810.ray + 0xfc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_810.ray + 0xfc);
                      iVar3 = *(int *)(local_810.hit + 0x44);
                      iVar4 = *(int *)(local_810.hit + 0x48);
                      iVar1 = *(int *)(local_810.hit + 0x4c);
                      bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar61 >> 2) & 1);
                      bVar10 = SUB81(uVar61 >> 3,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)(bVar57 & 1) * *(int *)(local_810.hit + 0x40) |
                           (uint)!(bool)(bVar57 & 1) * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar62 * iVar3 | (uint)!bVar62 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_810.ray + 0x10c);
                      auVar68 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x50));
                      *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar68;
                      auVar68 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x60));
                      *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar68;
                      auVar68 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x70));
                      *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar68;
                      auVar68 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x80));
                      *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar68;
                      goto LAB_01a754ea;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar163;
                }
              }
            }
LAB_01a754ea:
            uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar213._4_4_ = uVar147;
            auVar213._0_4_ = uVar147;
            auVar213._8_4_ = uVar147;
            auVar213._12_4_ = uVar147;
            auVar213._16_4_ = uVar147;
            auVar213._20_4_ = uVar147;
            auVar213._24_4_ = uVar147;
            auVar213._28_4_ = uVar147;
            auVar207 = ZEXT3264(auVar213);
            auVar53._4_4_ = fStack_31c;
            auVar53._0_4_ = local_320;
            auVar53._8_4_ = fStack_318;
            auVar53._12_4_ = fStack_314;
            auVar53._16_4_ = fStack_310;
            auVar53._20_4_ = fStack_30c;
            auVar53._24_4_ = fStack_308;
            auVar53._28_4_ = fStack_304;
            uVar16 = vcmpps_avx512vl(auVar213,auVar53,0xd);
          }
          uVar19 = vpcmpd_avx512vl(local_2e0,local_280,1);
          uVar18 = vpcmpd_avx512vl(local_2e0,_local_340,1);
          auVar158._0_4_ = (float)local_680._0_4_ + (float)local_200._0_4_;
          auVar158._4_4_ = (float)local_680._4_4_ + (float)local_200._4_4_;
          auVar158._8_4_ = fStack_678 + fStack_1f8;
          auVar158._12_4_ = fStack_674 + fStack_1f4;
          auVar158._16_4_ = fStack_670 + fStack_1f0;
          auVar158._20_4_ = fStack_66c + fStack_1ec;
          auVar158._24_4_ = fStack_668 + fStack_1e8;
          auVar158._28_4_ = fStack_664 + fStack_1e4;
          uVar147 = auVar207._0_4_;
          auVar192._4_4_ = uVar147;
          auVar192._0_4_ = uVar147;
          auVar192._8_4_ = uVar147;
          auVar192._12_4_ = uVar147;
          auVar192._16_4_ = uVar147;
          auVar192._20_4_ = uVar147;
          auVar192._24_4_ = uVar147;
          auVar192._28_4_ = uVar147;
          uVar16 = vcmpps_avx512vl(auVar158,auVar192,2);
          bVar59 = (byte)local_88c & (byte)uVar19 & (byte)uVar16;
          auVar199._0_4_ = (float)local_680._0_4_ + (float)local_2c0._0_4_;
          auVar199._4_4_ = (float)local_680._4_4_ + (float)local_2c0._4_4_;
          auVar199._8_4_ = fStack_678 + fStack_2b8;
          auVar199._12_4_ = fStack_674 + fStack_2b4;
          auVar199._16_4_ = fStack_670 + fStack_2b0;
          auVar199._20_4_ = fStack_66c + fStack_2ac;
          auVar199._24_4_ = fStack_668 + fStack_2a8;
          auVar199._28_4_ = fStack_664 + fStack_2a4;
          uVar16 = vcmpps_avx512vl(auVar199,auVar192,2);
          bVar55 = bVar55 & (byte)uVar18 & (byte)uVar16 | bVar59;
          if (bVar55 != 0) {
            abStack_180[uVar60 * 0x60] = bVar55;
            bVar62 = (bool)(bVar59 >> 1 & 1);
            bVar9 = (bool)(bVar59 >> 2 & 1);
            bVar10 = (bool)(bVar59 >> 3 & 1);
            bVar11 = (bool)(bVar59 >> 4 & 1);
            bVar12 = (bool)(bVar59 >> 5 & 1);
            bVar13 = (bool)(bVar59 >> 6 & 1);
            auStack_160[uVar60 * 0x18] =
                 (uint)(bVar59 & 1) * local_200._0_4_ | (uint)!(bool)(bVar59 & 1) * local_2c0._0_4_;
            auStack_160[uVar60 * 0x18 + 1] =
                 (uint)bVar62 * local_200._4_4_ | (uint)!bVar62 * local_2c0._4_4_;
            auStack_160[uVar60 * 0x18 + 2] =
                 (uint)bVar9 * (int)fStack_1f8 | (uint)!bVar9 * (int)fStack_2b8;
            auStack_160[uVar60 * 0x18 + 3] =
                 (uint)bVar10 * (int)fStack_1f4 | (uint)!bVar10 * (int)fStack_2b4;
            auStack_160[uVar60 * 0x18 + 4] =
                 (uint)bVar11 * (int)fStack_1f0 | (uint)!bVar11 * (int)fStack_2b0;
            auStack_160[uVar60 * 0x18 + 5] =
                 (uint)bVar12 * (int)fStack_1ec | (uint)!bVar12 * (int)fStack_2ac;
            auStack_160[uVar60 * 0x18 + 6] =
                 (uint)bVar13 * (int)fStack_1e8 | (uint)!bVar13 * (int)fStack_2a8;
            auStack_160[uVar60 * 0x18 + 7] =
                 (uint)(bVar59 >> 7) * (int)fStack_1e4 |
                 (uint)!(bool)(bVar59 >> 7) * (int)fStack_2a4;
            uVar61 = vmovlps_avx(local_2f0);
            (&uStack_140)[uVar60 * 0xc] = uVar61;
            aiStack_138[uVar60 * 0x18] = local_a28 + 1;
            uVar60 = (ulong)((int)uVar60 + 1);
          }
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar242 = ZEXT3264(auVar90);
          auVar207 = ZEXT3264(_DAT_01f7b040);
          prim = local_7d0;
          fVar132 = (float)local_680._0_4_;
          fVar161 = (float)local_680._4_4_;
          fVar163 = fStack_678;
          fVar165 = fStack_674;
          fVar133 = fStack_670;
          fVar167 = fStack_66c;
          fVar169 = fStack_668;
          fVar194 = fStack_664;
        }
      }
    }
    do {
      uVar65 = (uint)uVar60;
      uVar60 = (ulong)(uVar65 - 1);
      if (uVar65 == 0) {
        uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar35._4_4_ = uVar147;
        auVar35._0_4_ = uVar147;
        auVar35._8_4_ = uVar147;
        auVar35._12_4_ = uVar147;
        auVar35._16_4_ = uVar147;
        auVar35._20_4_ = uVar147;
        auVar35._24_4_ = uVar147;
        auVar35._28_4_ = uVar147;
        uVar16 = vcmpps_avx512vl(local_260,auVar35,2);
        local_7c8 = (ulong)((uint)local_7c8 & (uint)uVar16);
        goto LAB_01a73074;
      }
      auVar90 = *(undefined1 (*) [32])(auStack_160 + uVar60 * 0x18);
      auVar159._0_4_ = fVar132 + auVar90._0_4_;
      auVar159._4_4_ = fVar161 + auVar90._4_4_;
      auVar159._8_4_ = fVar163 + auVar90._8_4_;
      auVar159._12_4_ = fVar165 + auVar90._12_4_;
      auVar159._16_4_ = fVar133 + auVar90._16_4_;
      auVar159._20_4_ = fVar167 + auVar90._20_4_;
      auVar159._24_4_ = fVar169 + auVar90._24_4_;
      auVar159._28_4_ = fVar194 + auVar90._28_4_;
      uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar34._4_4_ = uVar147;
      auVar34._0_4_ = uVar147;
      auVar34._8_4_ = uVar147;
      auVar34._12_4_ = uVar147;
      auVar34._16_4_ = uVar147;
      auVar34._20_4_ = uVar147;
      auVar34._24_4_ = uVar147;
      auVar34._28_4_ = uVar147;
      uVar16 = vcmpps_avx512vl(auVar159,auVar34,2);
      uVar125 = (uint)uVar16 & (uint)abStack_180[uVar60 * 0x60];
    } while (uVar125 == 0);
    uVar61 = (&uStack_140)[uVar60 * 0xc];
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar61;
    auVar193._8_4_ = 0x7f800000;
    auVar193._0_8_ = 0x7f8000007f800000;
    auVar193._12_4_ = 0x7f800000;
    auVar193._16_4_ = 0x7f800000;
    auVar193._20_4_ = 0x7f800000;
    auVar193._24_4_ = 0x7f800000;
    auVar193._28_4_ = 0x7f800000;
    auVar79 = vblendmps_avx512vl(auVar193,auVar90);
    bVar55 = (byte)uVar125;
    auVar124._0_4_ =
         (uint)(bVar55 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)auVar90._0_4_;
    bVar62 = (bool)((byte)(uVar125 >> 1) & 1);
    auVar124._4_4_ = (uint)bVar62 * auVar79._4_4_ | (uint)!bVar62 * (int)auVar90._4_4_;
    bVar62 = (bool)((byte)(uVar125 >> 2) & 1);
    auVar124._8_4_ = (uint)bVar62 * auVar79._8_4_ | (uint)!bVar62 * (int)auVar90._8_4_;
    bVar62 = (bool)((byte)(uVar125 >> 3) & 1);
    auVar124._12_4_ = (uint)bVar62 * auVar79._12_4_ | (uint)!bVar62 * (int)auVar90._12_4_;
    bVar62 = (bool)((byte)(uVar125 >> 4) & 1);
    auVar124._16_4_ = (uint)bVar62 * auVar79._16_4_ | (uint)!bVar62 * (int)auVar90._16_4_;
    bVar62 = (bool)((byte)(uVar125 >> 5) & 1);
    auVar124._20_4_ = (uint)bVar62 * auVar79._20_4_ | (uint)!bVar62 * (int)auVar90._20_4_;
    bVar62 = (bool)((byte)(uVar125 >> 6) & 1);
    auVar124._24_4_ = (uint)bVar62 * auVar79._24_4_ | (uint)!bVar62 * (int)auVar90._24_4_;
    auVar124._28_4_ =
         (uVar125 >> 7) * auVar79._28_4_ | (uint)!SUB41(uVar125 >> 7,0) * (int)auVar90._28_4_;
    auVar90 = vshufps_avx(auVar124,auVar124,0xb1);
    auVar90 = vminps_avx(auVar124,auVar90);
    auVar79 = vshufpd_avx(auVar90,auVar90,5);
    auVar90 = vminps_avx(auVar90,auVar79);
    auVar79 = vpermpd_avx2(auVar90,0x4e);
    auVar90 = vminps_avx(auVar90,auVar79);
    uVar16 = vcmpps_avx512vl(auVar124,auVar90,0);
    bVar59 = (byte)uVar16 & bVar55;
    if (bVar59 != 0) {
      uVar125 = (uint)bVar59;
    }
    uVar126 = 0;
    for (; (uVar125 & 1) == 0; uVar125 = uVar125 >> 1 | 0x80000000) {
      uVar126 = uVar126 + 1;
    }
    local_a28 = aiStack_138[uVar60 * 0x18];
    bVar55 = ~('\x01' << ((byte)uVar126 & 0x1f)) & bVar55;
    abStack_180[uVar60 * 0x60] = bVar55;
    if (bVar55 == 0) {
      uVar65 = uVar65 - 1;
    }
    uVar147 = (undefined4)uVar61;
    auVar145._4_4_ = uVar147;
    auVar145._0_4_ = uVar147;
    auVar145._8_4_ = uVar147;
    auVar145._12_4_ = uVar147;
    auVar145._16_4_ = uVar147;
    auVar145._20_4_ = uVar147;
    auVar145._24_4_ = uVar147;
    auVar145._28_4_ = uVar147;
    auVar68 = vmovshdup_avx(auVar156);
    auVar68 = vsubps_avx(auVar68,auVar156);
    auVar160._0_4_ = auVar68._0_4_;
    auVar160._4_4_ = auVar160._0_4_;
    auVar160._8_4_ = auVar160._0_4_;
    auVar160._12_4_ = auVar160._0_4_;
    auVar160._16_4_ = auVar160._0_4_;
    auVar160._20_4_ = auVar160._0_4_;
    auVar160._24_4_ = auVar160._0_4_;
    auVar160._28_4_ = auVar160._0_4_;
    auVar68 = vfmadd132ps_fma(auVar160,auVar145,auVar207._0_32_);
    _local_460 = ZEXT1632(auVar68);
    local_2f0._8_8_ = 0;
    local_2f0._0_8_ = *(ulong *)(local_460 + (ulong)uVar126 * 4);
    uVar60 = (ulong)uVar65;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }